

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [60];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  byte bVar49;
  uint uVar50;
  ulong uVar51;
  long lVar53;
  uint uVar54;
  long lVar55;
  ulong uVar56;
  uint uVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar86 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  int iVar123;
  float fVar124;
  undefined4 uVar125;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vfloat4 a0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vint4 ai;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar194;
  float fVar203;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar204;
  float fVar219;
  float fVar220;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar221;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  float fVar236;
  float fVar245;
  float fVar246;
  vfloat4 b0_2;
  undefined1 auVar237 [16];
  float fVar247;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar267;
  undefined1 auVar266 [16];
  vfloat4 a0_4;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_640;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  uint auStack_5f0 [4];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar52;
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  float fVar152;
  float fVar161;
  float fVar162;
  float fVar177;
  float fVar178;
  float fVar193;
  
  PVar6 = prim[1];
  uVar51 = (ulong)(byte)PVar6;
  lVar53 = uVar51 * 0x25;
  fVar124 = *(float *)(prim + lVar53 + 0x12);
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar63 = vsubps_avx(auVar63,*(undefined1 (*) [16])(prim + lVar53 + 6));
  auVar87._0_4_ = fVar124 * auVar63._0_4_;
  auVar87._4_4_ = fVar124 * auVar63._4_4_;
  auVar87._8_4_ = fVar124 * auVar63._8_4_;
  auVar87._12_4_ = fVar124 * auVar63._12_4_;
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 4 + 6)));
  auVar67._0_4_ = fVar124 * auVar64._0_4_;
  auVar67._4_4_ = fVar124 * auVar64._4_4_;
  auVar67._8_4_ = fVar124 * auVar64._8_4_;
  auVar67._12_4_ = fVar124 * auVar64._12_4_;
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 5 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 6 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0xf + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar51 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0x1a + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0x1b + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0x1c + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar163._4_4_ = auVar67._0_4_;
  auVar163._0_4_ = auVar67._0_4_;
  auVar163._8_4_ = auVar67._0_4_;
  auVar163._12_4_ = auVar67._0_4_;
  auVar82 = vshufps_avx(auVar67,auVar67,0x55);
  auVar83 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar124 = auVar83._0_4_;
  auVar80._0_4_ = fVar124 * auVar74._0_4_;
  fVar250 = auVar83._4_4_;
  auVar80._4_4_ = fVar250 * auVar74._4_4_;
  fVar236 = auVar83._8_4_;
  auVar80._8_4_ = fVar236 * auVar74._8_4_;
  fVar245 = auVar83._12_4_;
  auVar80._12_4_ = fVar245 * auVar74._12_4_;
  auVar72._0_4_ = auVar78._0_4_ * fVar124;
  auVar72._4_4_ = auVar78._4_4_ * fVar250;
  auVar72._8_4_ = auVar78._8_4_ * fVar236;
  auVar72._12_4_ = auVar78._12_4_ * fVar245;
  auVar66._0_4_ = auVar81._0_4_ * fVar124;
  auVar66._4_4_ = auVar81._4_4_ * fVar250;
  auVar66._8_4_ = auVar81._8_4_ * fVar236;
  auVar66._12_4_ = auVar81._12_4_ * fVar245;
  auVar83 = vfmadd231ps_fma(auVar80,auVar82,auVar64);
  auVar28 = vfmadd231ps_fma(auVar72,auVar82,auVar77);
  auVar82 = vfmadd231ps_fma(auVar66,auVar76,auVar82);
  auVar29 = vfmadd231ps_fma(auVar83,auVar163,auVar63);
  auVar28 = vfmadd231ps_fma(auVar28,auVar163,auVar73);
  auVar84 = vfmadd231ps_fma(auVar82,auVar75,auVar163);
  auVar268._4_4_ = auVar87._0_4_;
  auVar268._0_4_ = auVar87._0_4_;
  auVar268._8_4_ = auVar87._0_4_;
  auVar268._12_4_ = auVar87._0_4_;
  auVar82 = vshufps_avx(auVar87,auVar87,0x55);
  auVar83 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar124 = auVar83._0_4_;
  auVar164._0_4_ = fVar124 * auVar74._0_4_;
  fVar250 = auVar83._4_4_;
  auVar164._4_4_ = fVar250 * auVar74._4_4_;
  fVar236 = auVar83._8_4_;
  auVar164._8_4_ = fVar236 * auVar74._8_4_;
  fVar245 = auVar83._12_4_;
  auVar164._12_4_ = fVar245 * auVar74._12_4_;
  auVar89._0_4_ = auVar78._0_4_ * fVar124;
  auVar89._4_4_ = auVar78._4_4_ * fVar250;
  auVar89._8_4_ = auVar78._8_4_ * fVar236;
  auVar89._12_4_ = auVar78._12_4_ * fVar245;
  auVar88._0_4_ = auVar81._0_4_ * fVar124;
  auVar88._4_4_ = auVar81._4_4_ * fVar250;
  auVar88._8_4_ = auVar81._8_4_ * fVar236;
  auVar88._12_4_ = auVar81._12_4_ * fVar245;
  auVar64 = vfmadd231ps_fma(auVar164,auVar82,auVar64);
  auVar74 = vfmadd231ps_fma(auVar89,auVar82,auVar77);
  auVar77 = vfmadd231ps_fma(auVar88,auVar82,auVar76);
  auVar65 = vfmadd231ps_fma(auVar64,auVar268,auVar63);
  auVar67 = vfmadd231ps_fma(auVar74,auVar268,auVar73);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar284 = ZEXT1664(auVar63);
  auVar66 = vfmadd231ps_fma(auVar77,auVar268,auVar75);
  auVar64 = vandps_avx512vl(auVar29,auVar63);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar64,auVar195,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar68._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar29._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar29._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar29._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar29._12_4_;
  auVar64 = vandps_avx512vl(auVar28,auVar63);
  uVar62 = vcmpps_avx512vl(auVar64,auVar195,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar69._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar28._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar28._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar28._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar28._12_4_;
  auVar63 = vandps_avx512vl(auVar84,auVar63);
  uVar62 = vcmpps_avx512vl(auVar63,auVar195,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar70._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar84._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar84._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar84._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar84._12_4_;
  auVar64 = vrcp14ps_avx512vl(auVar68);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = 0x3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar63 = vfnmadd213ps_fma(auVar68,auVar64,auVar196);
  auVar29 = vfmadd132ps_fma(auVar63,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar69);
  auVar63 = vfnmadd213ps_fma(auVar69,auVar64,auVar196);
  auVar84 = vfmadd132ps_fma(auVar63,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar70);
  auVar63 = vfnmadd213ps_fma(auVar70,auVar64,auVar196);
  auVar85 = vfmadd132ps_fma(auVar63,auVar64,auVar64);
  fVar124 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar53 + 0x16)) *
            *(float *)(prim + lVar53 + 0x1a);
  auVar179._4_4_ = fVar124;
  auVar179._0_4_ = fVar124;
  auVar179._8_4_ = fVar124;
  auVar179._12_4_ = fVar124;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar51 * 7 + 6);
  auVar63 = vpmovsxwd_avx(auVar63);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar51 * 0xb + 6);
  auVar64 = vpmovsxwd_avx(auVar64);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar73 = vsubps_avx(auVar64,auVar63);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar51 * 9 + 6);
  auVar64 = vpmovsxwd_avx(auVar74);
  auVar74 = vfmadd213ps_fma(auVar73,auVar179,auVar63);
  auVar63 = vcvtdq2ps_avx(auVar64);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar51 * 0xd + 6);
  auVar64 = vpmovsxwd_avx(auVar73);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar64 = vsubps_avx(auVar64,auVar63);
  auVar73 = vfmadd213ps_fma(auVar64,auVar179,auVar63);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar51 * 0x12 + 6);
  auVar63 = vpmovsxwd_avx(auVar77);
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar62 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar51 * 2 + uVar62 + 6);
  auVar64 = vpmovsxwd_avx(auVar78);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar64 = vsubps_avx(auVar64,auVar63);
  auVar77 = vfmadd213ps_fma(auVar64,auVar179,auVar63);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar63 = vpmovsxwd_avx(auVar75);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar51 * 0x18 + 6);
  auVar64 = vpmovsxwd_avx(auVar76);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar64 = vsubps_avx(auVar64,auVar63);
  auVar78 = vfmadd213ps_fma(auVar64,auVar179,auVar63);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar51 * 0x1d + 6);
  auVar63 = vpmovsxwd_avx(auVar81);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar64 = vpmovsxwd_avx(auVar82);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar64 = vsubps_avx(auVar64,auVar63);
  auVar75 = vfmadd213ps_fma(auVar64,auVar179,auVar63);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar51) + 6);
  auVar63 = vpmovsxwd_avx(auVar83);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar51 * 0x23 + 6);
  auVar64 = vpmovsxwd_avx(auVar28);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar64 = vsubps_avx(auVar64,auVar63);
  auVar64 = vfmadd213ps_fma(auVar64,auVar179,auVar63);
  auVar63 = vsubps_avx(auVar74,auVar65);
  auVar180._0_4_ = auVar29._0_4_ * auVar63._0_4_;
  auVar180._4_4_ = auVar29._4_4_ * auVar63._4_4_;
  auVar180._8_4_ = auVar29._8_4_ * auVar63._8_4_;
  auVar180._12_4_ = auVar29._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar73,auVar65);
  auVar86._0_4_ = auVar29._0_4_ * auVar63._0_4_;
  auVar86._4_4_ = auVar29._4_4_ * auVar63._4_4_;
  auVar86._8_4_ = auVar29._8_4_ * auVar63._8_4_;
  auVar86._12_4_ = auVar29._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar77,auVar67);
  auVar165._0_4_ = auVar84._0_4_ * auVar63._0_4_;
  auVar165._4_4_ = auVar84._4_4_ * auVar63._4_4_;
  auVar165._8_4_ = auVar84._8_4_ * auVar63._8_4_;
  auVar165._12_4_ = auVar84._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar78,auVar67);
  auVar79._0_4_ = auVar84._0_4_ * auVar63._0_4_;
  auVar79._4_4_ = auVar84._4_4_ * auVar63._4_4_;
  auVar79._8_4_ = auVar84._8_4_ * auVar63._8_4_;
  auVar79._12_4_ = auVar84._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar75,auVar66);
  auVar153._0_4_ = auVar85._0_4_ * auVar63._0_4_;
  auVar153._4_4_ = auVar85._4_4_ * auVar63._4_4_;
  auVar153._8_4_ = auVar85._8_4_ * auVar63._8_4_;
  auVar153._12_4_ = auVar85._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar64,auVar66);
  auVar71._0_4_ = auVar85._0_4_ * auVar63._0_4_;
  auVar71._4_4_ = auVar85._4_4_ * auVar63._4_4_;
  auVar71._8_4_ = auVar85._8_4_ * auVar63._8_4_;
  auVar71._12_4_ = auVar85._12_4_ * auVar63._12_4_;
  auVar63 = vpminsd_avx(auVar180,auVar86);
  auVar64 = vpminsd_avx(auVar165,auVar79);
  auVar63 = vmaxps_avx(auVar63,auVar64);
  auVar64 = vpminsd_avx(auVar153,auVar71);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar29._4_4_ = uVar125;
  auVar29._0_4_ = uVar125;
  auVar29._8_4_ = uVar125;
  auVar29._12_4_ = uVar125;
  auVar64 = vmaxps_avx512vl(auVar64,auVar29);
  auVar63 = vmaxps_avx(auVar63,auVar64);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar63,auVar84);
  auVar63 = vpmaxsd_avx(auVar180,auVar86);
  auVar64 = vpmaxsd_avx(auVar165,auVar79);
  auVar63 = vminps_avx(auVar63,auVar64);
  auVar64 = vpmaxsd_avx(auVar153,auVar71);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar85._4_4_ = uVar125;
  auVar85._0_4_ = uVar125;
  auVar85._8_4_ = uVar125;
  auVar85._12_4_ = uVar125;
  auVar64 = vminps_avx512vl(auVar64,auVar85);
  auVar63 = vminps_avx(auVar63,auVar64);
  auVar65._8_4_ = 0x3f800003;
  auVar65._0_8_ = 0x3f8000033f800003;
  auVar65._12_4_ = 0x3f800003;
  auVar63 = vmulps_avx512vl(auVar63,auVar65);
  auVar64 = vpbroadcastd_avx512vl();
  uVar26 = vcmpps_avx512vl(local_5e0,auVar63,2);
  uVar62 = vpcmpgtd_avx512vl(auVar64,_DAT_01f7fcf0);
  uVar62 = ((byte)uVar26 & 0xf) & uVar62;
  if ((char)uVar62 != '\0') {
    auVar133 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar133);
    auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar133 = ZEXT1664(auVar63);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar283 = ZEXT1664(auVar63);
    do {
      lVar53 = 0;
      for (uVar51 = uVar62; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
        lVar53 = lVar53 + 1;
      }
      uVar57 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar57].ptr;
      fVar124 = (pGVar9->time_range).lower;
      fVar124 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar124) /
                ((pGVar9->time_range).upper - fVar124));
      auVar63 = vroundss_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),9);
      uVar7 = *(uint *)(prim + lVar53 * 4 + 6);
      auVar64 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar63 = vminss_avx(auVar63,auVar64);
      auVar65 = vmaxss_avx512f(auVar133._0_16_,auVar63);
      uVar51 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)uVar7 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar55 = (long)(int)auVar65._0_4_ * 0x38;
      lVar11 = *(long *)(_Var10 + lVar55);
      lVar12 = *(long *)(_Var10 + 0x10 + lVar55);
      auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar51);
      lVar53 = uVar51 + 1;
      auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar53);
      lVar1 = uVar51 + 2;
      auVar74 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      lVar2 = uVar51 + 3;
      auVar73 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
      lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
      lVar12 = *(long *)(lVar11 + lVar55);
      lVar13 = *(long *)(lVar11 + 0x10 + lVar55);
      auVar77 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar51);
      auVar78 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar53);
      auVar75 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
      auVar76 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
      lVar12 = *(long *)(_Var10 + 0x38 + lVar55);
      lVar13 = *(long *)(_Var10 + 0x48 + lVar55);
      auVar81 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar51);
      auVar82 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar53);
      auVar83 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
      auVar28 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
      lVar12 = *(long *)(lVar11 + 0x38 + lVar55);
      lVar11 = *(long *)(lVar11 + 0x48 + lVar55);
      auVar29 = *(undefined1 (*) [16])(lVar12 + uVar51 * lVar11);
      auVar84 = *(undefined1 (*) [16])(lVar12 + lVar53 * lVar11);
      auVar85 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
      auVar66 = vsubss_avx512f(ZEXT416((uint)fVar124),auVar65);
      auVar126._0_12_ = ZEXT812(0);
      auVar126._12_4_ = 0;
      auVar65 = vmulps_avx512vl(auVar73,auVar126);
      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar74,auVar126);
      auVar67 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar64,auVar65);
      auVar68 = vaddps_avx512vl(auVar63,auVar67);
      auVar86 = auVar283._0_16_;
      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar64,auVar86);
      auVar69 = vfnmadd231ps_avx512vl(auVar65,auVar63,auVar86);
      auVar145._0_4_ = auVar76._0_4_ * 0.0;
      auVar145._4_4_ = auVar76._4_4_ * 0.0;
      auVar145._8_4_ = auVar76._8_4_ * 0.0;
      auVar145._12_4_ = auVar76._12_4_ * 0.0;
      auVar65 = vfmadd231ps_fma(auVar145,auVar75,auVar126);
      auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar67 = vfmadd213ps_avx512vl(auVar67,auVar78,auVar65);
      auVar70 = vaddps_avx512vl(auVar77,auVar67);
      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar78,auVar86);
      auVar71 = vfnmadd231ps_avx512vl(auVar65,auVar77,auVar86);
      auVar65 = vxorps_avx512vl(auVar67,auVar67);
      auVar65 = vfmadd213ps_avx512vl(auVar65,auVar74,auVar73);
      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar64,auVar126);
      auVar72 = vfmadd231ps_avx512vl(auVar65,auVar63,auVar126);
      auVar73 = vmulps_avx512vl(auVar73,auVar86);
      auVar74 = vfnmadd231ps_avx512vl(auVar73,auVar86,auVar74);
      auVar64 = vfmadd231ps_fma(auVar74,auVar126,auVar64);
      auVar67 = vfnmadd231ps_fma(auVar64,auVar126,auVar63);
      auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar75,auVar76);
      auVar63 = vfmadd231ps_fma(auVar63,auVar78,auVar126);
      auVar65 = vfmadd231ps_fma(auVar63,auVar77,auVar126);
      auVar63 = vmulps_avx512vl(auVar76,auVar86);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar86,auVar75);
      auVar63 = vfmadd231ps_fma(auVar63,auVar126,auVar78);
      auVar78 = vfnmadd231ps_fma(auVar63,auVar126,auVar77);
      auVar64 = vshufps_avx512vl(auVar69,auVar69,0xc9);
      auVar63 = vshufps_avx512vl(auVar70,auVar70,0xc9);
      auVar63 = vmulps_avx512vl(auVar69,auVar63);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar64,auVar70);
      auVar74 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar63 = vshufps_avx(auVar71,auVar71,0xc9);
      auVar63 = vmulps_avx512vl(auVar69,auVar63);
      auVar63 = vfmsub231ps_fma(auVar63,auVar64,auVar71);
      auVar73 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar63 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar64 = vshufps_avx(auVar65,auVar65,0xc9);
      auVar181._0_4_ = auVar67._0_4_ * auVar64._0_4_;
      auVar181._4_4_ = auVar67._4_4_ * auVar64._4_4_;
      auVar181._8_4_ = auVar67._8_4_ * auVar64._8_4_;
      auVar181._12_4_ = auVar67._12_4_ * auVar64._12_4_;
      auVar64 = vfmsub231ps_fma(auVar181,auVar63,auVar65);
      auVar77 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vshufps_avx(auVar78,auVar78,0xc9);
      auVar182._0_4_ = auVar67._0_4_ * auVar64._0_4_;
      auVar182._4_4_ = auVar67._4_4_ * auVar64._4_4_;
      auVar182._8_4_ = auVar67._8_4_ * auVar64._8_4_;
      auVar182._12_4_ = auVar67._12_4_ * auVar64._12_4_;
      auVar63 = vfmsub231ps_fma(auVar182,auVar63,auVar78);
      auVar78 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar63 = vdpps_avx(auVar74,auVar74,0x7f);
      auVar64 = vrsqrt14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar75 = vmulss_avx512f(auVar64,ZEXT416(0x3fc00000));
      auVar76 = vmulss_avx512f(auVar63,ZEXT416(0x3f000000));
      auVar76 = vmulss_avx512f(auVar76,auVar64);
      auVar64 = vmulss_avx512f(auVar76,ZEXT416((uint)(auVar64._0_4_ * auVar64._0_4_)));
      fVar236 = auVar75._0_4_ - auVar64._0_4_;
      auVar205._4_4_ = fVar236;
      auVar205._0_4_ = fVar236;
      auVar205._8_4_ = fVar236;
      auVar205._12_4_ = fVar236;
      auVar64 = vdpps_avx(auVar74,auVar73,0x7f);
      auVar75 = vmulps_avx512vl(auVar74,auVar205);
      auVar76 = vbroadcastss_avx512vl(auVar63);
      auVar73 = vmulps_avx512vl(auVar76,auVar73);
      fVar124 = auVar64._0_4_;
      auVar166._0_4_ = fVar124 * auVar74._0_4_;
      auVar166._4_4_ = fVar124 * auVar74._4_4_;
      auVar166._8_4_ = fVar124 * auVar74._8_4_;
      auVar166._12_4_ = fVar124 * auVar74._12_4_;
      auVar74 = vsubps_avx(auVar73,auVar166);
      auVar64 = vrcp14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar63 = vfnmadd213ss_avx512f(auVar63,auVar64,ZEXT416(0x40000000));
      fVar124 = auVar64._0_4_ * auVar63._0_4_;
      auVar63 = vdpps_avx(auVar77,auVar77,0x7f);
      auVar64 = vrsqrt14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar73 = vmulss_avx512f(auVar64,ZEXT416(0x3fc00000));
      auVar76 = vmulss_avx512f(auVar63,ZEXT416(0x3f000000));
      fVar250 = auVar64._0_4_;
      fVar245 = auVar73._0_4_ - auVar76._0_4_ * fVar250 * fVar250 * fVar250;
      auVar206._0_4_ = auVar77._0_4_ * fVar245;
      auVar206._4_4_ = auVar77._4_4_ * fVar245;
      auVar206._8_4_ = auVar77._8_4_ * fVar245;
      auVar206._12_4_ = auVar77._12_4_ * fVar245;
      auVar64 = vdpps_avx(auVar77,auVar78,0x7f);
      auVar73 = vbroadcastss_avx512vl(auVar63);
      auVar73 = vmulps_avx512vl(auVar73,auVar78);
      fVar250 = auVar64._0_4_;
      auVar134._0_4_ = fVar250 * auVar77._0_4_;
      auVar134._4_4_ = fVar250 * auVar77._4_4_;
      auVar134._8_4_ = fVar250 * auVar77._8_4_;
      auVar134._12_4_ = fVar250 * auVar77._12_4_;
      auVar64 = vsubps_avx(auVar73,auVar134);
      auVar73 = vrcp14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar63 = vfnmadd213ss_avx512f(auVar63,auVar73,ZEXT416(0x40000000));
      fVar250 = auVar73._0_4_ * auVar63._0_4_;
      auVar63 = vshufps_avx512vl(auVar68,auVar68,0xff);
      auVar73 = vmulps_avx512vl(auVar63,auVar75);
      auVar76 = vsubps_avx512vl(auVar68,auVar73);
      auVar77 = vshufps_avx512vl(auVar69,auVar69,0xff);
      auVar77 = vmulps_avx512vl(auVar77,auVar75);
      auVar154._0_4_ = auVar77._0_4_ + auVar63._0_4_ * fVar236 * fVar124 * auVar74._0_4_;
      auVar154._4_4_ = auVar77._4_4_ + auVar63._4_4_ * fVar236 * fVar124 * auVar74._4_4_;
      auVar154._8_4_ = auVar77._8_4_ + auVar63._8_4_ * fVar236 * fVar124 * auVar74._8_4_;
      auVar154._12_4_ = auVar77._12_4_ + auVar63._12_4_ * fVar236 * fVar124 * auVar74._12_4_;
      auVar74 = vsubps_avx512vl(auVar69,auVar154);
      auVar65 = vaddps_avx512vl(auVar68,auVar73);
      auVar73 = vaddps_avx512vl(auVar69,auVar154);
      auVar63 = vshufps_avx512vl(auVar72,auVar72,0xff);
      auVar77 = vmulps_avx512vl(auVar63,auVar206);
      auVar68 = vsubps_avx512vl(auVar72,auVar77);
      auVar78 = vshufps_avx512vl(auVar67,auVar67,0xff);
      auVar75 = vmulps_avx512vl(auVar78,auVar206);
      auVar207._0_4_ = auVar75._0_4_ + auVar63._0_4_ * fVar245 * auVar64._0_4_ * fVar250;
      auVar207._4_4_ = auVar75._4_4_ + auVar63._4_4_ * fVar245 * auVar64._4_4_ * fVar250;
      auVar207._8_4_ = auVar75._8_4_ + auVar63._8_4_ * fVar245 * auVar64._8_4_ * fVar250;
      auVar207._12_4_ = auVar75._12_4_ + auVar63._12_4_ * fVar245 * auVar64._12_4_ * fVar250;
      auVar63 = vsubps_avx(auVar67,auVar207);
      auVar69 = vaddps_avx512vl(auVar72,auVar77);
      auVar77 = vaddps_avx512vl(auVar67,auVar207);
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar64 = vmulps_avx512vl(auVar74,auVar67);
      auVar197._0_4_ = auVar76._0_4_ + auVar64._0_4_;
      auVar197._4_4_ = auVar76._4_4_ + auVar64._4_4_;
      auVar197._8_4_ = auVar76._8_4_ + auVar64._8_4_;
      auVar197._12_4_ = auVar76._12_4_ + auVar64._12_4_;
      auVar63 = vmulps_avx512vl(auVar63,auVar67);
      auVar75 = vsubps_avx(auVar68,auVar63);
      auVar63 = vmulps_avx512vl(auVar73,auVar67);
      auVar70 = vaddps_avx512vl(auVar65,auVar63);
      auVar63 = vmulps_avx512vl(auVar77,auVar67);
      auVar71 = vsubps_avx512vl(auVar69,auVar63);
      auVar63 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
      auVar64 = vmulps_avx512vl(auVar28,auVar126);
      auVar64 = vfmadd231ps_fma(auVar64,auVar83,auVar126);
      auVar74 = vxorps_avx512vl(auVar77,auVar77);
      auVar74 = vfmadd213ps_avx512vl(auVar74,auVar82,auVar64);
      auVar72 = vaddps_avx512vl(auVar81,auVar74);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar82,auVar86);
      auVar79 = vfnmadd231ps_avx512vl(auVar64,auVar81,auVar86);
      auVar64 = vmulps_avx512vl(auVar63,auVar126);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar85,auVar126);
      auVar74 = vxorps_avx512vl(auVar78,auVar78);
      auVar74 = vfmadd213ps_avx512vl(auVar74,auVar84,auVar64);
      auVar73 = vaddps_avx512vl(auVar29,auVar74);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar84,auVar86);
      auVar77 = vfnmadd231ps_avx512vl(auVar64,auVar29,auVar86);
      auVar64 = vxorps_avx512vl(auVar74,auVar74);
      auVar64 = vfmadd213ps_avx512vl(auVar64,auVar83,auVar28);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar82,auVar126);
      auVar80 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar126);
      auVar64 = vmulps_avx512vl(auVar28,auVar86);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar86,auVar83);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar126,auVar82);
      auVar81 = vfnmadd231ps_avx512vl(auVar64,auVar126,auVar81);
      auVar64 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar85,auVar63);
      auVar64 = vfmadd231ps_fma(auVar64,auVar84,auVar126);
      auVar64 = vfmadd231ps_fma(auVar64,auVar29,auVar126);
      auVar63 = vmulps_avx512vl(auVar63,auVar86);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar86,auVar85);
      auVar63 = vfmadd231ps_fma(auVar63,auVar126,auVar84);
      auVar78 = vfnmadd231ps_fma(auVar63,auVar126,auVar29);
      auVar63 = vshufps_avx(auVar79,auVar79,0xc9);
      auVar74 = vshufps_avx512vl(auVar73,auVar73,0xc9);
      fVar245 = auVar79._0_4_;
      auVar251._0_4_ = fVar245 * auVar74._0_4_;
      fVar246 = auVar79._4_4_;
      auVar251._4_4_ = fVar246 * auVar74._4_4_;
      fVar152 = auVar79._8_4_;
      auVar251._8_4_ = fVar152 * auVar74._8_4_;
      fVar161 = auVar79._12_4_;
      auVar251._12_4_ = fVar161 * auVar74._12_4_;
      auVar74 = vfmsub231ps_avx512vl(auVar251,auVar63,auVar73);
      auVar74 = vshufps_avx(auVar74,auVar74,0xc9);
      auVar73 = vshufps_avx512vl(auVar77,auVar77,0xc9);
      auVar261._0_4_ = fVar245 * auVar73._0_4_;
      auVar261._4_4_ = fVar246 * auVar73._4_4_;
      auVar261._8_4_ = fVar152 * auVar73._8_4_;
      auVar261._12_4_ = fVar161 * auVar73._12_4_;
      auVar63 = vfmsub231ps_avx512vl(auVar261,auVar63,auVar77);
      auVar73 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar82 = vshufps_avx512vl(auVar81,auVar81,0xc9);
      auVar63 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar63 = vmulps_avx512vl(auVar81,auVar63);
      auVar63 = vfmsub231ps_fma(auVar63,auVar82,auVar64);
      auVar77 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar64 = vshufps_avx(auVar78,auVar78,0xc9);
      auVar63 = vdpps_avx(auVar74,auVar74,0x7f);
      auVar64 = vmulps_avx512vl(auVar81,auVar64);
      auVar64 = vfmsub231ps_fma(auVar64,auVar82,auVar78);
      auVar78 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vrsqrt14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar82 = vmulss_avx512f(auVar64,ZEXT416(0x3fc00000));
      auVar83 = vmulss_avx512f(auVar63,ZEXT416(0x3f000000));
      auVar83 = vmulss_avx512f(auVar83,auVar64);
      auVar64 = vmulss_avx512f(auVar83,ZEXT416((uint)(auVar64._0_4_ * auVar64._0_4_)));
      auVar64 = vsubss_avx512f(auVar82,auVar64);
      auVar274._0_4_ = auVar64._0_4_;
      auVar274._4_4_ = auVar274._0_4_;
      auVar274._8_4_ = auVar274._0_4_;
      auVar274._12_4_ = auVar274._0_4_;
      auVar82 = vmulps_avx512vl(auVar74,auVar274);
      auVar64 = vdpps_avx(auVar74,auVar73,0x7f);
      auVar83 = vbroadcastss_avx512vl(auVar63);
      auVar73 = vmulps_avx512vl(auVar83,auVar73);
      fVar124 = auVar64._0_4_;
      auVar183._0_4_ = auVar74._0_4_ * fVar124;
      auVar183._4_4_ = auVar74._4_4_ * fVar124;
      auVar183._8_4_ = auVar74._8_4_ * fVar124;
      auVar183._12_4_ = auVar74._12_4_ * fVar124;
      auVar74 = vsubps_avx(auVar73,auVar183);
      auVar64 = vrcp14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar63 = vfnmadd213ss_avx512f(auVar63,auVar64,ZEXT416(0x40000000));
      fVar124 = auVar64._0_4_ * auVar63._0_4_;
      auVar63 = vdpps_avx(auVar77,auVar77,0x7f);
      auVar64 = vrsqrt14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar73 = vmulss_avx512f(auVar64,ZEXT416(0x3fc00000));
      auVar83 = vmulss_avx512f(auVar63,ZEXT416(0x3f000000));
      fVar250 = auVar64._0_4_;
      fVar236 = auVar73._0_4_ - auVar83._0_4_ * fVar250 * fVar250 * fVar250;
      auVar269._0_4_ = auVar77._0_4_ * fVar236;
      auVar269._4_4_ = auVar77._4_4_ * fVar236;
      auVar269._8_4_ = auVar77._8_4_ * fVar236;
      auVar269._12_4_ = auVar77._12_4_ * fVar236;
      auVar64 = vdpps_avx(auVar77,auVar78,0x7f);
      auVar73 = vbroadcastss_avx512vl(auVar63);
      auVar73 = vmulps_avx512vl(auVar73,auVar78);
      fVar250 = auVar64._0_4_;
      auVar230._0_4_ = auVar77._0_4_ * fVar250;
      auVar230._4_4_ = auVar77._4_4_ * fVar250;
      auVar230._8_4_ = auVar77._8_4_ * fVar250;
      auVar230._12_4_ = auVar77._12_4_ * fVar250;
      auVar64 = vsubps_avx(auVar73,auVar230);
      auVar73 = vrcp14ss_avx512f(auVar126,ZEXT416(auVar63._0_4_));
      auVar63 = vfnmadd213ss_avx512f(auVar63,auVar73,ZEXT416(0x40000000));
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      fVar250 = auVar63._0_4_ * auVar73._0_4_;
      auVar73 = vshufps_avx512vl(auVar72,auVar72,0xff);
      auVar77 = vmulps_avx512vl(auVar73,auVar82);
      auVar78 = vsubps_avx512vl(auVar72,auVar77);
      auVar63 = vshufps_avx(auVar79,auVar79,0xff);
      auVar63 = vmulps_avx512vl(auVar63,auVar82);
      auVar167._0_4_ = auVar63._0_4_ + auVar73._0_4_ * auVar274._0_4_ * fVar124 * auVar74._0_4_;
      auVar167._4_4_ = auVar63._4_4_ + auVar73._4_4_ * auVar274._0_4_ * fVar124 * auVar74._4_4_;
      auVar167._8_4_ = auVar63._8_4_ + auVar73._8_4_ * auVar274._0_4_ * fVar124 * auVar74._8_4_;
      auVar167._12_4_ = auVar63._12_4_ + auVar73._12_4_ * auVar274._0_4_ * fVar124 * auVar74._12_4_;
      auVar63 = vsubps_avx(auVar79,auVar167);
      auVar74 = vaddps_avx512vl(auVar72,auVar77);
      auVar168._0_4_ = fVar245 + auVar167._0_4_;
      auVar168._4_4_ = fVar246 + auVar167._4_4_;
      auVar168._8_4_ = fVar152 + auVar167._8_4_;
      auVar168._12_4_ = fVar161 + auVar167._12_4_;
      auVar73 = vshufps_avx512vl(auVar80,auVar80,0xff);
      auVar262._0_4_ = auVar73._0_4_ * auVar269._0_4_;
      auVar262._4_4_ = auVar73._4_4_ * auVar269._4_4_;
      auVar262._8_4_ = auVar73._8_4_ * auVar269._8_4_;
      auVar262._12_4_ = auVar73._12_4_ * auVar269._12_4_;
      auVar77 = vsubps_avx512vl(auVar80,auVar262);
      auVar82 = vshufps_avx512vl(auVar81,auVar81,0xff);
      auVar82 = vmulps_avx512vl(auVar82,auVar269);
      auVar184._0_4_ = auVar82._0_4_ + auVar73._0_4_ * fVar236 * auVar64._0_4_ * fVar250;
      auVar184._4_4_ = auVar82._4_4_ + auVar73._4_4_ * fVar236 * auVar64._4_4_ * fVar250;
      auVar184._8_4_ = auVar82._8_4_ + auVar73._8_4_ * fVar236 * auVar64._8_4_ * fVar250;
      auVar184._12_4_ = auVar82._12_4_ + auVar73._12_4_ * fVar236 * auVar64._12_4_ * fVar250;
      auVar64 = vsubps_avx512vl(auVar81,auVar184);
      auVar73 = vaddps_avx512vl(auVar80,auVar262);
      auVar81 = vaddps_avx512vl(auVar81,auVar184);
      auVar63 = vmulps_avx512vl(auVar63,auVar67);
      auVar231._0_4_ = auVar78._0_4_ + auVar63._0_4_;
      auVar231._4_4_ = auVar78._4_4_ + auVar63._4_4_;
      auVar231._8_4_ = auVar78._8_4_ + auVar63._8_4_;
      auVar231._12_4_ = auVar78._12_4_ + auVar63._12_4_;
      auVar63 = vmulps_avx512vl(auVar64,auVar67);
      auVar63 = vsubps_avx(auVar77,auVar63);
      auVar64 = vmulps_avx512vl(auVar168,auVar67);
      auVar169._0_4_ = auVar74._0_4_ + auVar64._0_4_;
      auVar169._4_4_ = auVar74._4_4_ + auVar64._4_4_;
      auVar169._8_4_ = auVar74._8_4_ + auVar64._8_4_;
      auVar169._12_4_ = auVar74._12_4_ + auVar64._12_4_;
      auVar64 = vmulps_avx512vl(auVar81,auVar67);
      auVar286 = ZEXT464(0x3f800000);
      auVar64 = vsubps_avx(auVar73,auVar64);
      auVar81 = vbroadcastss_avx512vl(auVar66);
      auVar82 = vsubss_avx512f(ZEXT416(0x3f800000),auVar66);
      auVar127._0_4_ = auVar82._0_4_;
      auVar127._4_4_ = auVar127._0_4_;
      auVar127._8_4_ = auVar127._0_4_;
      auVar127._12_4_ = auVar127._0_4_;
      auVar78 = vmulps_avx512vl(auVar81,auVar78);
      auVar82 = vmulps_avx512vl(auVar81,auVar231);
      auVar63 = vmulps_avx512vl(auVar81,auVar63);
      auVar275._0_4_ = auVar81._0_4_ * auVar77._0_4_;
      auVar275._4_4_ = auVar81._4_4_ * auVar77._4_4_;
      auVar275._8_4_ = auVar81._8_4_ * auVar77._8_4_;
      auVar275._12_4_ = auVar81._12_4_ * auVar77._12_4_;
      local_520 = vfmadd231ps_avx512vl(auVar78,auVar127,auVar76);
      local_530 = vfmadd231ps_avx512vl(auVar82,auVar127,auVar197);
      local_540 = vfmadd231ps_avx512vl(auVar63,auVar127,auVar75);
      local_550 = vfmadd231ps_fma(auVar275,auVar127,auVar68);
      auVar63 = vmulps_avx512vl(auVar81,auVar74);
      auVar74 = vmulps_avx512vl(auVar81,auVar169);
      auVar64 = vmulps_avx512vl(auVar81,auVar64);
      auVar263._0_4_ = auVar81._0_4_ * auVar73._0_4_;
      auVar263._4_4_ = auVar81._4_4_ * auVar73._4_4_;
      auVar263._8_4_ = auVar81._8_4_ * auVar73._8_4_;
      auVar263._12_4_ = auVar81._12_4_ * auVar73._12_4_;
      _local_560 = vfmadd231ps_avx512vl(auVar63,auVar127,auVar65);
      _local_570 = vfmadd231ps_avx512vl(auVar74,auVar127,auVar70);
      _local_580 = vfmadd231ps_avx512vl(auVar64,auVar127,auVar71);
      _local_590 = vfmadd231ps_fma(auVar263,auVar127,auVar69);
      auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar124 = *(float *)(ray + k * 4 + 0xc0);
      local_4a0 = vsubps_avx512vl(local_520,auVar63);
      uVar125 = local_4a0._0_4_;
      auVar135._4_4_ = uVar125;
      auVar135._0_4_ = uVar125;
      auVar135._8_4_ = uVar125;
      auVar135._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4a0,local_4a0,0x55);
      auVar74 = vshufps_avx(local_4a0,local_4a0,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar250 = pre->ray_space[k].vz.field_0.m128[0];
      fVar236 = pre->ray_space[k].vz.field_0.m128[1];
      fVar245 = pre->ray_space[k].vz.field_0.m128[2];
      fVar246 = pre->ray_space[k].vz.field_0.m128[3];
      auVar128._0_4_ = fVar250 * auVar74._0_4_;
      auVar128._4_4_ = fVar236 * auVar74._4_4_;
      auVar128._8_4_ = fVar245 * auVar74._8_4_;
      auVar128._12_4_ = fVar246 * auVar74._12_4_;
      auVar64 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar5,auVar64);
      auVar78 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar135);
      local_4b0 = vsubps_avx512vl(local_530,auVar63);
      uVar125 = local_4b0._0_4_;
      auVar139._4_4_ = uVar125;
      auVar139._0_4_ = uVar125;
      auVar139._8_4_ = uVar125;
      auVar139._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4b0,local_4b0,0x55);
      auVar74 = vshufps_avx(local_4b0,local_4b0,0xaa);
      auVar136._0_4_ = fVar250 * auVar74._0_4_;
      auVar136._4_4_ = fVar236 * auVar74._4_4_;
      auVar136._8_4_ = fVar245 * auVar74._8_4_;
      auVar136._12_4_ = fVar246 * auVar74._12_4_;
      auVar64 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar5,auVar64);
      auVar75 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar139);
      local_4c0 = vsubps_avx512vl(local_540,auVar63);
      uVar125 = local_4c0._0_4_;
      auVar185._4_4_ = uVar125;
      auVar185._0_4_ = uVar125;
      auVar185._8_4_ = uVar125;
      auVar185._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4c0,local_4c0,0x55);
      auVar74 = vshufps_avx(local_4c0,local_4c0,0xaa);
      auVar140._0_4_ = fVar250 * auVar74._0_4_;
      auVar140._4_4_ = fVar236 * auVar74._4_4_;
      auVar140._8_4_ = fVar245 * auVar74._8_4_;
      auVar140._12_4_ = fVar246 * auVar74._12_4_;
      auVar64 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar5,auVar64);
      auVar76 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar185);
      local_4d0 = vsubps_avx(local_550,auVar63);
      uVar125 = local_4d0._0_4_;
      auVar208._4_4_ = uVar125;
      auVar208._0_4_ = uVar125;
      auVar208._8_4_ = uVar125;
      auVar208._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar74 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar186._0_4_ = fVar250 * auVar74._0_4_;
      auVar186._4_4_ = fVar236 * auVar74._4_4_;
      auVar186._8_4_ = fVar245 * auVar74._8_4_;
      auVar186._12_4_ = fVar246 * auVar74._12_4_;
      auVar64 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar64);
      auVar81 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar208);
      local_4e0 = vsubps_avx512vl(_local_560,auVar63);
      uVar125 = local_4e0._0_4_;
      auVar209._4_4_ = uVar125;
      auVar209._0_4_ = uVar125;
      auVar209._8_4_ = uVar125;
      auVar209._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar74 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar232._0_4_ = auVar74._0_4_ * fVar250;
      auVar232._4_4_ = auVar74._4_4_ * fVar236;
      auVar232._8_4_ = auVar74._8_4_ * fVar245;
      auVar232._12_4_ = auVar74._12_4_ * fVar246;
      auVar64 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar5,auVar64);
      auVar82 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar209);
      local_4f0 = vsubps_avx512vl(_local_570,auVar63);
      uVar125 = local_4f0._0_4_;
      auVar210._4_4_ = uVar125;
      auVar210._0_4_ = uVar125;
      auVar210._8_4_ = uVar125;
      auVar210._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar74 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar237._0_4_ = auVar74._0_4_ * fVar250;
      auVar237._4_4_ = auVar74._4_4_ * fVar236;
      auVar237._8_4_ = auVar74._8_4_ * fVar245;
      auVar237._12_4_ = auVar74._12_4_ * fVar246;
      auVar64 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar5,auVar64);
      auVar83 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar210);
      local_500 = vsubps_avx512vl(_local_580,auVar63);
      uVar125 = local_500._0_4_;
      auVar211._4_4_ = uVar125;
      auVar211._0_4_ = uVar125;
      auVar211._8_4_ = uVar125;
      auVar211._12_4_ = uVar125;
      auVar64 = vshufps_avx(local_500,local_500,0x55);
      auVar74 = vshufps_avx(local_500,local_500,0xaa);
      auVar252._0_4_ = auVar74._0_4_ * fVar250;
      auVar252._4_4_ = auVar74._4_4_ * fVar236;
      auVar252._8_4_ = auVar74._8_4_ * fVar245;
      auVar252._12_4_ = auVar74._12_4_ * fVar246;
      auVar64 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar5,auVar64);
      auVar28 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar211);
      local_510 = vsubps_avx(_local_590,auVar63);
      uVar125 = local_510._0_4_;
      auVar155._4_4_ = uVar125;
      auVar155._0_4_ = uVar125;
      auVar155._8_4_ = uVar125;
      auVar155._12_4_ = uVar125;
      auVar63 = vshufps_avx(local_510,local_510,0x55);
      auVar64 = vshufps_avx(local_510,local_510,0xaa);
      auVar198._0_4_ = auVar64._0_4_ * fVar250;
      auVar198._4_4_ = auVar64._4_4_ * fVar236;
      auVar198._8_4_ = auVar64._8_4_ * fVar245;
      auVar198._12_4_ = auVar64._12_4_ * fVar246;
      auVar63 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar63);
      auVar29 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar155);
      auVar74 = vmovlhps_avx(auVar78,auVar82);
      auVar73 = vmovlhps_avx(auVar75,auVar83);
      local_600 = vmovlhps_avx(auVar76,auVar28);
      _local_460 = vmovlhps_avx512f(auVar81,auVar29);
      auVar64 = vminps_avx(auVar74,auVar73);
      auVar63 = vmaxps_avx(auVar74,auVar73);
      auVar77 = vminps_avx512vl(local_600,_local_460);
      auVar64 = vminps_avx(auVar64,auVar77);
      auVar77 = vmaxps_avx512vl(local_600,_local_460);
      auVar63 = vmaxps_avx(auVar63,auVar77);
      auVar77 = vshufpd_avx(auVar64,auVar64,3);
      auVar64 = vminps_avx(auVar64,auVar77);
      auVar77 = vshufpd_avx(auVar63,auVar63,3);
      auVar63 = vmaxps_avx(auVar63,auVar77);
      auVar64 = vandps_avx512vl(auVar64,auVar284._0_16_);
      auVar63 = vandps_avx512vl(auVar63,auVar284._0_16_);
      auVar63 = vmaxps_avx(auVar64,auVar63);
      auVar64 = vmovshdup_avx(auVar63);
      auVar63 = vmaxss_avx(auVar64,auVar63);
      local_610 = vmovddup_avx512vl(auVar78);
      auVar285 = ZEXT1664(local_610);
      auVar64 = vmovddup_avx512vl(auVar75);
      auVar77 = vmovddup_avx512vl(auVar76);
      auVar78 = vmovddup_avx512vl(auVar81);
      local_450 = ZEXT416((uint)(auVar63._0_4_ * 9.536743e-07));
      local_440 = vbroadcastss_avx512vl(local_450);
      auVar63 = vxorps_avx512vl(local_440._0_16_,auVar84);
      local_3c0 = auVar63._0_4_;
      uStack_3bc = local_3c0;
      uStack_3b8 = local_3c0;
      uStack_3b4 = local_3c0;
      uStack_3b0 = local_3c0;
      uStack_3ac = local_3c0;
      uStack_3a8 = local_3c0;
      uStack_3a4 = local_3c0;
      uVar51 = 0;
      local_470 = vsubps_avx(auVar73,auVar74);
      local_480 = vsubps_avx(local_600,auVar73);
      local_490 = vsubps_avx512vl(_local_460,local_600);
      local_5a0 = vsubps_avx512vl(_local_560,local_520);
      local_5b0 = vsubps_avx512vl(_local_570,local_530);
      local_5c0 = vsubps_avx512vl(_local_580,local_540);
      _local_5d0 = vsubps_avx(_local_590,local_550);
      auVar133 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar133);
      auVar133 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar133);
      auVar63 = ZEXT816(0x3f80000000000000);
      auVar121._32_32_ = auVar133._32_32_;
      auVar137 = auVar63;
LAB_01b951aa:
      auVar75 = vshufps_avx(auVar137,auVar137,0x50);
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._0_16_ = auVar270;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar270,auVar75);
      fVar250 = auVar75._0_4_;
      fVar152 = auVar82._0_4_;
      auVar156._0_4_ = fVar152 * fVar250;
      fVar236 = auVar75._4_4_;
      fVar161 = auVar82._4_4_;
      auVar156._4_4_ = fVar161 * fVar236;
      fVar245 = auVar75._8_4_;
      auVar156._8_4_ = fVar152 * fVar245;
      fVar246 = auVar75._12_4_;
      auVar156._12_4_ = fVar161 * fVar246;
      fVar162 = auVar83._0_4_;
      auVar170._0_4_ = fVar162 * fVar250;
      fVar177 = auVar83._4_4_;
      auVar170._4_4_ = fVar177 * fVar236;
      auVar170._8_4_ = fVar162 * fVar245;
      auVar170._12_4_ = fVar177 * fVar246;
      fVar178 = auVar28._0_4_;
      auVar187._0_4_ = fVar178 * fVar250;
      fVar193 = auVar28._4_4_;
      auVar187._4_4_ = fVar193 * fVar236;
      auVar187._8_4_ = fVar178 * fVar245;
      auVar187._12_4_ = fVar193 * fVar246;
      fVar194 = auVar29._0_4_;
      auVar141._0_4_ = fVar194 * fVar250;
      fVar203 = auVar29._4_4_;
      auVar141._4_4_ = fVar203 * fVar236;
      auVar141._8_4_ = fVar194 * fVar245;
      auVar141._12_4_ = fVar203 * fVar246;
      auVar81 = vfmadd231ps_avx512vl(auVar156,auVar76,auVar285._0_16_);
      auVar84 = vfmadd231ps_avx512vl(auVar170,auVar76,auVar64);
      auVar85 = vfmadd231ps_avx512vl(auVar187,auVar76,auVar77);
      auVar76 = vfmadd231ps_avx512vl(auVar141,auVar78,auVar76);
      auVar75 = vmovshdup_avx(auVar63);
      fVar236 = auVar63._0_4_;
      fVar250 = (auVar75._0_4_ - fVar236) * 0.04761905;
      auVar104._4_4_ = fVar236;
      auVar104._0_4_ = fVar236;
      auVar104._8_4_ = fVar236;
      auVar104._12_4_ = fVar236;
      auVar104._16_4_ = fVar236;
      auVar104._20_4_ = fVar236;
      auVar104._24_4_ = fVar236;
      auVar104._28_4_ = fVar236;
      auVar96._0_8_ = auVar75._0_8_;
      auVar96._8_8_ = auVar96._0_8_;
      auVar96._16_8_ = auVar96._0_8_;
      auVar96._24_8_ = auVar96._0_8_;
      auVar133._0_32_ = vsubps_avx(auVar96,auVar104);
      uVar125 = auVar81._0_4_;
      auVar107._4_4_ = uVar125;
      auVar107._0_4_ = uVar125;
      auVar107._8_4_ = uVar125;
      auVar107._12_4_ = uVar125;
      auVar107._16_4_ = uVar125;
      auVar107._20_4_ = uVar125;
      auVar107._24_4_ = uVar125;
      auVar107._28_4_ = uVar125;
      auVar97._8_4_ = 1;
      auVar97._0_8_ = 0x100000001;
      auVar97._12_4_ = 1;
      auVar97._16_4_ = 1;
      auVar97._20_4_ = 1;
      auVar97._24_4_ = 1;
      auVar97._28_4_ = 1;
      auVar106 = ZEXT1632(auVar81);
      auVar105 = vpermps_avx2(auVar97,auVar106);
      auVar90 = vbroadcastss_avx512vl(auVar84);
      auVar100 = ZEXT1632(auVar84);
      auVar91 = vpermps_avx512vl(auVar97,auVar100);
      auVar92 = vbroadcastss_avx512vl(auVar85);
      auVar101 = ZEXT1632(auVar85);
      auVar93 = vpermps_avx512vl(auVar97,auVar101);
      auVar94 = vbroadcastss_avx512vl(auVar76);
      auVar103 = ZEXT1632(auVar76);
      auVar95 = vpermps_avx512vl(auVar97,auVar103);
      auVar108._4_4_ = fVar250;
      auVar108._0_4_ = fVar250;
      auVar108._8_4_ = fVar250;
      auVar108._12_4_ = fVar250;
      auVar108._16_4_ = fVar250;
      auVar108._20_4_ = fVar250;
      auVar108._24_4_ = fVar250;
      auVar108._28_4_ = fVar250;
      auVar102._8_4_ = 2;
      auVar102._0_8_ = 0x200000002;
      auVar102._12_4_ = 2;
      auVar102._16_4_ = 2;
      auVar102._20_4_ = 2;
      auVar102._24_4_ = 2;
      auVar102._28_4_ = 2;
      auVar96 = vpermps_avx512vl(auVar102,auVar106);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar98 = vpermps_avx512vl(auVar97,auVar106);
      auVar99 = vpermps_avx512vl(auVar102,auVar100);
      auVar100 = vpermps_avx512vl(auVar97,auVar100);
      auVar106 = vpermps_avx2(auVar102,auVar101);
      auVar101 = vpermps_avx512vl(auVar97,auVar101);
      auVar102 = vpermps_avx512vl(auVar102,auVar103);
      auVar97 = vpermps_avx512vl(auVar97,auVar103);
      auVar75 = vfmadd132ps_fma(auVar133._0_32_,auVar104,_DAT_01faff20);
      auVar133._0_32_ = vsubps_avx(auVar109,ZEXT1632(auVar75));
      auVar103 = vmulps_avx512vl(auVar90,ZEXT1632(auVar75));
      auVar109 = ZEXT1632(auVar75);
      auVar104 = vmulps_avx512vl(auVar91,auVar109);
      auVar76 = vfmadd231ps_fma(auVar103,auVar133._0_32_,auVar107);
      auVar81 = vfmadd231ps_fma(auVar104,auVar133._0_32_,auVar105);
      auVar103 = vmulps_avx512vl(auVar92,auVar109);
      auVar104 = vmulps_avx512vl(auVar93,auVar109);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar133._0_32_,auVar90);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar133._0_32_,auVar91);
      auVar90 = vmulps_avx512vl(auVar94,auVar109);
      auVar107 = ZEXT1632(auVar75);
      auVar91 = vmulps_avx512vl(auVar95,auVar107);
      auVar92 = vfmadd231ps_avx512vl(auVar90,auVar133._0_32_,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar91,auVar133._0_32_,auVar93);
      fVar245 = auVar75._0_4_;
      fVar246 = auVar75._4_4_;
      auVar90._4_4_ = fVar246 * auVar103._4_4_;
      auVar90._0_4_ = fVar245 * auVar103._0_4_;
      fVar247 = auVar75._8_4_;
      auVar90._8_4_ = fVar247 * auVar103._8_4_;
      fVar248 = auVar75._12_4_;
      auVar90._12_4_ = fVar248 * auVar103._12_4_;
      auVar90._16_4_ = auVar103._16_4_ * 0.0;
      auVar90._20_4_ = auVar103._20_4_ * 0.0;
      auVar90._24_4_ = auVar103._24_4_ * 0.0;
      auVar90._28_4_ = fVar236;
      auVar91._4_4_ = fVar246 * auVar104._4_4_;
      auVar91._0_4_ = fVar245 * auVar104._0_4_;
      auVar91._8_4_ = fVar247 * auVar104._8_4_;
      auVar91._12_4_ = fVar248 * auVar104._12_4_;
      auVar91._16_4_ = auVar104._16_4_ * 0.0;
      auVar91._20_4_ = auVar104._20_4_ * 0.0;
      auVar91._24_4_ = auVar104._24_4_ * 0.0;
      auVar91._28_4_ = auVar105._28_4_;
      auVar76 = vfmadd231ps_fma(auVar90,auVar133._0_32_,ZEXT1632(auVar76));
      auVar81 = vfmadd231ps_fma(auVar91,auVar133._0_32_,ZEXT1632(auVar81));
      auVar95._0_4_ = fVar245 * auVar92._0_4_;
      auVar95._4_4_ = fVar246 * auVar92._4_4_;
      auVar95._8_4_ = fVar247 * auVar92._8_4_;
      auVar95._12_4_ = fVar248 * auVar92._12_4_;
      auVar95._16_4_ = auVar92._16_4_ * 0.0;
      auVar95._20_4_ = auVar92._20_4_ * 0.0;
      auVar95._24_4_ = auVar92._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      auVar105._4_4_ = fVar246 * auVar93._4_4_;
      auVar105._0_4_ = fVar245 * auVar93._0_4_;
      auVar105._8_4_ = fVar247 * auVar93._8_4_;
      auVar105._12_4_ = fVar248 * auVar93._12_4_;
      auVar105._16_4_ = auVar93._16_4_ * 0.0;
      auVar105._20_4_ = auVar93._20_4_ * 0.0;
      auVar105._24_4_ = auVar93._24_4_ * 0.0;
      auVar105._28_4_ = auVar92._28_4_;
      auVar84 = vfmadd231ps_fma(auVar95,auVar133._0_32_,auVar103);
      auVar85 = vfmadd231ps_fma(auVar105,auVar133._0_32_,auVar104);
      auVar92._28_4_ = auVar104._28_4_;
      auVar92._0_28_ =
           ZEXT1628(CONCAT412(fVar248 * auVar85._12_4_,
                              CONCAT48(fVar247 * auVar85._8_4_,
                                       CONCAT44(fVar246 * auVar85._4_4_,fVar245 * auVar85._0_4_))));
      auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar248 * auVar84._12_4_,
                                                   CONCAT48(fVar247 * auVar84._8_4_,
                                                            CONCAT44(fVar246 * auVar84._4_4_,
                                                                     fVar245 * auVar84._0_4_)))),
                                auVar133._0_32_,ZEXT1632(auVar76));
      auVar67 = vfmadd231ps_fma(auVar92,auVar133._0_32_,ZEXT1632(auVar81));
      auVar105 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar76));
      auVar90 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar81));
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar105 = vmulps_avx512vl(auVar105,auVar91);
      auVar90 = vmulps_avx512vl(auVar90,auVar91);
      auVar103._0_4_ = fVar250 * auVar105._0_4_;
      auVar103._4_4_ = fVar250 * auVar105._4_4_;
      auVar103._8_4_ = fVar250 * auVar105._8_4_;
      auVar103._12_4_ = fVar250 * auVar105._12_4_;
      auVar103._16_4_ = fVar250 * auVar105._16_4_;
      auVar103._20_4_ = fVar250 * auVar105._20_4_;
      auVar103._24_4_ = fVar250 * auVar105._24_4_;
      auVar103._28_4_ = 0;
      auVar105 = vmulps_avx512vl(auVar108,auVar90);
      auVar81 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
      auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01feed00,ZEXT1632(auVar81));
      auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01feed00,ZEXT1632(auVar81));
      auVar144._0_4_ = auVar103._0_4_ + auVar65._0_4_;
      auVar144._4_4_ = auVar103._4_4_ + auVar65._4_4_;
      auVar144._8_4_ = auVar103._8_4_ + auVar65._8_4_;
      auVar144._12_4_ = auVar103._12_4_ + auVar65._12_4_;
      auVar144._16_4_ = auVar103._16_4_ + 0.0;
      auVar144._20_4_ = auVar103._20_4_ + 0.0;
      auVar144._24_4_ = auVar103._24_4_ + 0.0;
      auVar144._28_4_ = 0;
      auVar104 = ZEXT1632(auVar81);
      auVar93 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar104);
      auVar95 = vaddps_avx512vl(ZEXT1632(auVar67),auVar105);
      auVar94 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar104);
      auVar105 = vsubps_avx(auVar90,auVar93);
      auVar103 = vsubps_avx512vl(auVar92,auVar94);
      auVar93 = vmulps_avx512vl(auVar99,auVar107);
      auVar94 = vmulps_avx512vl(auVar100,auVar107);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar133._0_32_,auVar96);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar133._0_32_,auVar98);
      auVar96 = vmulps_avx512vl(auVar106,auVar107);
      auVar98 = vmulps_avx512vl(auVar101,auVar107);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar133._0_32_,auVar99);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar133._0_32_,auVar100);
      auVar99 = vmulps_avx512vl(auVar102,auVar107);
      auVar97 = vmulps_avx512vl(auVar97,auVar107);
      auVar76 = vfmadd231ps_fma(auVar99,auVar133._0_32_,auVar106);
      auVar106 = vfmadd231ps_avx512vl(auVar97,auVar133._0_32_,auVar101);
      auVar97 = vmulps_avx512vl(auVar107,auVar96);
      auVar100 = ZEXT1632(auVar75);
      auVar99 = vmulps_avx512vl(auVar100,auVar98);
      auVar93 = vfmadd231ps_avx512vl(auVar97,auVar133._0_32_,auVar93);
      auVar94 = vfmadd231ps_avx512vl(auVar99,auVar133._0_32_,auVar94);
      auVar106 = vmulps_avx512vl(auVar100,auVar106);
      auVar96 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar248 * auVar76._12_4_,
                                              CONCAT48(fVar247 * auVar76._8_4_,
                                                       CONCAT44(fVar246 * auVar76._4_4_,
                                                                fVar245 * auVar76._0_4_)))),
                           auVar133._0_32_,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar106,auVar133._0_32_,auVar98);
      auVar106._4_4_ = fVar246 * auVar96._4_4_;
      auVar106._0_4_ = fVar245 * auVar96._0_4_;
      auVar106._8_4_ = fVar247 * auVar96._8_4_;
      auVar106._12_4_ = fVar248 * auVar96._12_4_;
      auVar106._16_4_ = auVar96._16_4_ * 0.0;
      auVar106._20_4_ = auVar96._20_4_ * 0.0;
      auVar106._24_4_ = auVar96._24_4_ * 0.0;
      auVar106._28_4_ = auVar101._28_4_;
      auVar98 = vmulps_avx512vl(auVar100,auVar97);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar133._0_32_,auVar93);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar133._0_32_);
      auVar133._0_32_ = vsubps_avx512vl(auVar96,auVar93);
      auVar93 = vsubps_avx512vl(auVar97,auVar94);
      auVar133._0_32_ = vmulps_avx512vl(auVar133._0_32_,auVar91);
      auVar91 = vmulps_avx512vl(auVar93,auVar91);
      fVar236 = fVar250 * auVar133._0_4_;
      fVar245 = fVar250 * auVar133._4_4_;
      auVar93._4_4_ = fVar245;
      auVar93._0_4_ = fVar236;
      fVar246 = fVar250 * auVar133._8_4_;
      auVar93._8_4_ = fVar246;
      fVar247 = fVar250 * auVar133._12_4_;
      auVar93._12_4_ = fVar247;
      fVar248 = fVar250 * auVar133._16_4_;
      auVar93._16_4_ = fVar248;
      fVar249 = fVar250 * auVar133._20_4_;
      auVar93._20_4_ = fVar249;
      fVar250 = fVar250 * auVar133._24_4_;
      auVar93._24_4_ = fVar250;
      auVar93._28_4_ = auVar133._28_4_;
      auVar91 = vmulps_avx512vl(auVar108,auVar91);
      auVar96 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar104);
      auVar97 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,auVar104);
      auVar235._0_4_ = auVar106._0_4_ + fVar236;
      auVar235._4_4_ = auVar106._4_4_ + fVar245;
      auVar235._8_4_ = auVar106._8_4_ + fVar246;
      auVar235._12_4_ = auVar106._12_4_ + fVar247;
      auVar235._16_4_ = auVar106._16_4_ + fVar248;
      auVar235._20_4_ = auVar106._20_4_ + fVar249;
      auVar235._24_4_ = auVar106._24_4_ + fVar250;
      auVar235._28_4_ = auVar106._28_4_ + auVar133._28_4_;
      auVar133._0_32_ = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,ZEXT1632(auVar81));
      auVar93 = vaddps_avx512vl(auVar98,auVar91);
      auVar91 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,ZEXT1632(auVar81));
      auVar133._0_32_ = vsubps_avx(auVar96,auVar133._0_32_);
      auVar91 = vsubps_avx512vl(auVar97,auVar91);
      auVar160 = ZEXT1632(auVar65);
      auVar94 = vsubps_avx512vl(auVar106,auVar160);
      auVar176 = ZEXT1632(auVar67);
      auVar99 = vsubps_avx512vl(auVar98,auVar176);
      auVar100 = vsubps_avx512vl(auVar96,auVar90);
      auVar94 = vaddps_avx512vl(auVar94,auVar100);
      auVar100 = vsubps_avx512vl(auVar97,auVar92);
      auVar99 = vaddps_avx512vl(auVar99,auVar100);
      auVar100 = vmulps_avx512vl(auVar176,auVar94);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar160,auVar99);
      auVar101 = vmulps_avx512vl(auVar95,auVar94);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar144,auVar99);
      auVar102 = vmulps_avx512vl(auVar103,auVar94);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar105,auVar99);
      auVar104 = vmulps_avx512vl(auVar92,auVar94);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar90,auVar99);
      auVar107 = vmulps_avx512vl(auVar98,auVar94);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar106,auVar99);
      auVar108 = vmulps_avx512vl(auVar93,auVar94);
      auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar235,auVar99);
      auVar109 = vmulps_avx512vl(auVar91,auVar94);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar133._0_32_,auVar99);
      auVar94 = vmulps_avx512vl(auVar97,auVar94);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar96,auVar99);
      auVar99 = vminps_avx512vl(auVar100,auVar101);
      auVar100 = vmaxps_avx512vl(auVar100,auVar101);
      auVar101 = vminps_avx512vl(auVar102,auVar104);
      auVar99 = vminps_avx512vl(auVar99,auVar101);
      auVar101 = vmaxps_avx512vl(auVar102,auVar104);
      auVar100 = vmaxps_avx512vl(auVar100,auVar101);
      auVar101 = vminps_avx512vl(auVar107,auVar108);
      auVar102 = vmaxps_avx512vl(auVar107,auVar108);
      auVar104 = vminps_avx512vl(auVar109,auVar94);
      auVar101 = vminps_avx512vl(auVar101,auVar104);
      auVar99 = vminps_avx512vl(auVar99,auVar101);
      auVar94 = vmaxps_avx512vl(auVar109,auVar94);
      auVar94 = vmaxps_avx512vl(auVar102,auVar94);
      auVar100 = vmaxps_avx512vl(auVar100,auVar94);
      uVar26 = vcmpps_avx512vl(auVar99,local_440,2);
      auVar94._4_4_ = uStack_3bc;
      auVar94._0_4_ = local_3c0;
      auVar94._8_4_ = uStack_3b8;
      auVar94._12_4_ = uStack_3b4;
      auVar94._16_4_ = uStack_3b0;
      auVar94._20_4_ = uStack_3ac;
      auVar94._24_4_ = uStack_3a8;
      auVar94._28_4_ = uStack_3a4;
      uVar27 = vcmpps_avx512vl(auVar100,auVar94,5);
      bVar49 = (byte)uVar26 & (byte)uVar27 & 0x7f;
      if (bVar49 == 0) {
        auVar63 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar133._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar283._32_32_ = auVar121._32_32_;
        auVar283._0_32_ = _DAT_01feed20;
        auVar110._16_48_ = auVar283._16_48_;
      }
      else {
        auVar99 = vsubps_avx512vl(auVar90,auVar160);
        auVar100 = vsubps_avx512vl(auVar92,auVar176);
        auVar101 = vsubps_avx512vl(auVar96,auVar106);
        auVar99 = vaddps_avx512vl(auVar99,auVar101);
        auVar101 = vsubps_avx512vl(auVar97,auVar98);
        auVar100 = vaddps_avx512vl(auVar100,auVar101);
        auVar101 = vmulps_avx512vl(auVar176,auVar99);
        auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar100,auVar160);
        auVar95 = vmulps_avx512vl(auVar95,auVar99);
        auVar95 = vfnmadd213ps_avx512vl(auVar144,auVar100,auVar95);
        auVar102 = vmulps_avx512vl(auVar103,auVar99);
        auVar102 = vfnmadd213ps_avx512vl(auVar105,auVar100,auVar102);
        auVar105 = vmulps_avx512vl(auVar92,auVar99);
        auVar92 = vfnmadd231ps_avx512vl(auVar105,auVar100,auVar90);
        auVar105 = vmulps_avx512vl(auVar98,auVar99);
        auVar98 = vfnmadd231ps_avx512vl(auVar105,auVar100,auVar106);
        auVar105 = vmulps_avx512vl(auVar93,auVar99);
        auVar93 = vfnmadd213ps_avx512vl(auVar235,auVar100,auVar105);
        auVar105 = vmulps_avx512vl(auVar91,auVar99);
        auVar103 = vfnmadd213ps_avx512vl(auVar133._0_32_,auVar100,auVar105);
        auVar133._0_32_ = vmulps_avx512vl(auVar97,auVar99);
        auVar96 = vfnmadd231ps_avx512vl(auVar133._0_32_,auVar96,auVar100);
        auVar105 = vminps_avx(auVar101,auVar95);
        auVar133._0_32_ = vmaxps_avx(auVar101,auVar95);
        auVar90 = vminps_avx(auVar102,auVar92);
        auVar90 = vminps_avx(auVar105,auVar90);
        auVar105 = vmaxps_avx(auVar102,auVar92);
        auVar133._0_32_ = vmaxps_avx(auVar133._0_32_,auVar105);
        auVar106 = vminps_avx(auVar98,auVar93);
        auVar105 = vmaxps_avx(auVar98,auVar93);
        auVar91 = vminps_avx(auVar103,auVar96);
        auVar106 = vminps_avx(auVar106,auVar91);
        auVar106 = vminps_avx(auVar90,auVar106);
        auVar90 = vmaxps_avx(auVar103,auVar96);
        auVar105 = vmaxps_avx(auVar105,auVar90);
        auVar133._0_32_ = vmaxps_avx(auVar133._0_32_,auVar105);
        uVar26 = vcmpps_avx512vl(auVar133._0_32_,auVar94,5);
        uVar27 = vcmpps_avx512vl(auVar106,local_440,2);
        bVar49 = bVar49 & (byte)uVar26 & (byte)uVar27;
        if (bVar49 != 0) {
          auStack_5f0[uVar51] = (uint)bVar49;
          uVar26 = vmovlps_avx(auVar63);
          (&uStack_420)[uVar51] = uVar26;
          uVar3 = vmovlps_avx(auVar137);
          auStack_3a0[uVar51] = uVar3;
          uVar51 = (ulong)((int)uVar51 + 1);
        }
        auVar63 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar133._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar133._32_32_ = auVar121._32_32_;
        auVar110._16_48_ = auVar133._16_48_;
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      auVar283 = ZEXT1664(auVar75);
      auVar282 = ZEXT3264(_DAT_01feed20);
      auVar281 = ZEXT1664(auVar76);
      in_ZMM19 = ZEXT3264(auVar133._0_32_);
      auVar133 = ZEXT1664(auVar63);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar287 = ZEXT1664(auVar63);
      if ((int)uVar51 != 0) {
        do {
          auVar121._32_32_ = auVar110._32_32_;
          auVar75 = auVar133._0_16_;
          auVar76 = auVar283._0_16_;
          uVar50 = (int)uVar51 - 1;
          uVar52 = (ulong)uVar50;
          uVar8 = auStack_5f0[uVar52];
          auVar137._8_8_ = 0;
          auVar137._0_8_ = auStack_3a0[uVar52];
          uVar3 = 0;
          for (uVar56 = (ulong)uVar8; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar54 = uVar8 - 1 & uVar8;
          bVar60 = uVar54 == 0;
          auStack_5f0[uVar52] = uVar54;
          if (bVar60) {
            uVar51 = (ulong)uVar50;
          }
          auVar129._8_8_ = 0;
          auVar129._0_8_ = uVar3;
          auVar63 = vpunpcklqdq_avx(auVar129,ZEXT416((int)uVar3 + 1));
          auVar63 = vcvtqq2ps_avx512vl(auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar281._0_16_);
          uVar125 = *(undefined4 *)((long)&uStack_420 + uVar52 * 8 + 4);
          auVar30._4_4_ = uVar125;
          auVar30._0_4_ = uVar125;
          auVar30._8_4_ = uVar125;
          auVar30._12_4_ = uVar125;
          auVar81 = vmulps_avx512vl(auVar63,auVar30);
          auVar146._8_4_ = 0x3f800000;
          auVar146._0_8_ = 0x3f8000003f800000;
          auVar146._12_4_ = 0x3f800000;
          auVar63 = vsubps_avx(auVar146,auVar63);
          uVar125 = *(undefined4 *)(&uStack_420 + uVar52);
          auVar31._4_4_ = uVar125;
          auVar31._0_4_ = uVar125;
          auVar31._8_4_ = uVar125;
          auVar31._12_4_ = uVar125;
          auVar63 = vfmadd231ps_avx512vl(auVar81,auVar63,auVar31);
          auVar81 = vmovshdup_avx(auVar63);
          fVar250 = auVar81._0_4_ - auVar63._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar250));
          if (uVar8 == 0 || bVar60) goto LAB_01b951aa;
          auVar81 = vshufps_avx(auVar137,auVar137,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar250));
          uVar50 = (uint)uVar51;
          auVar157._8_4_ = 0x3f800000;
          auVar157._0_8_ = 0x3f8000003f800000;
          auVar157._12_4_ = 0x3f800000;
          auVar84 = vsubps_avx(auVar157,auVar81);
          fVar236 = auVar81._0_4_;
          auVar171._0_4_ = fVar236 * fVar152;
          fVar245 = auVar81._4_4_;
          auVar171._4_4_ = fVar245 * fVar161;
          fVar246 = auVar81._8_4_;
          auVar171._8_4_ = fVar246 * fVar152;
          fVar247 = auVar81._12_4_;
          auVar171._12_4_ = fVar247 * fVar161;
          auVar188._0_4_ = fVar236 * fVar162;
          auVar188._4_4_ = fVar245 * fVar177;
          auVar188._8_4_ = fVar246 * fVar162;
          auVar188._12_4_ = fVar247 * fVar177;
          auVar199._0_4_ = fVar236 * fVar178;
          auVar199._4_4_ = fVar245 * fVar193;
          auVar199._8_4_ = fVar246 * fVar178;
          auVar199._12_4_ = fVar247 * fVar193;
          auVar147._0_4_ = fVar236 * fVar194;
          auVar147._4_4_ = fVar245 * fVar203;
          auVar147._8_4_ = fVar246 * fVar194;
          auVar147._12_4_ = fVar247 * fVar203;
          auVar65 = vfmadd231ps_avx512vl(auVar171,auVar84,auVar285._0_16_);
          auVar81 = vfmadd231ps_fma(auVar188,auVar84,auVar64);
          auVar85 = vfmadd231ps_fma(auVar199,auVar84,auVar77);
          auVar84 = vfmadd231ps_fma(auVar147,auVar84,auVar78);
          auVar98._16_16_ = auVar65;
          auVar98._0_16_ = auVar65;
          auVar99._16_16_ = auVar81;
          auVar99._0_16_ = auVar81;
          auVar101._16_16_ = auVar85;
          auVar101._0_16_ = auVar85;
          auVar90 = vpermps_avx512vl(auVar282._0_32_,ZEXT1632(auVar63));
          auVar105 = vsubps_avx(auVar99,auVar98);
          auVar65 = vfmadd213ps_fma(auVar105,auVar90,auVar98);
          auVar105 = vsubps_avx(auVar101,auVar99);
          auVar67 = vfmadd213ps_fma(auVar105,auVar90,auVar99);
          auVar81 = vsubps_avx(auVar84,auVar85);
          auVar100._16_16_ = auVar81;
          auVar100._0_16_ = auVar81;
          auVar81 = vfmadd213ps_fma(auVar100,auVar90,auVar101);
          auVar105 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar65));
          auVar84 = vfmadd213ps_fma(auVar105,auVar90,ZEXT1632(auVar65));
          auVar105 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar67));
          auVar81 = vfmadd213ps_fma(auVar105,auVar90,ZEXT1632(auVar67));
          auVar105 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar84));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar105,auVar90);
          auVar121._0_32_ = vmulps_avx512vl(auVar105,in_ZMM19._0_32_);
          auVar110._16_48_ = auVar121._16_48_;
          auVar81 = vmulss_avx512f(ZEXT416((uint)fVar250),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar236 = auVar81._0_4_;
          auVar200._0_8_ =
               CONCAT44(auVar79._4_4_ + fVar236 * auVar121._4_4_,
                        auVar79._0_4_ + fVar236 * auVar121._0_4_);
          auVar200._8_4_ = auVar79._8_4_ + fVar236 * auVar121._8_4_;
          auVar200._12_4_ = auVar79._12_4_ + fVar236 * auVar121._12_4_;
          auVar172._0_4_ = fVar236 * auVar121._16_4_;
          auVar172._4_4_ = fVar236 * auVar121._20_4_;
          auVar172._8_4_ = fVar236 * auVar121._24_4_;
          auVar172._12_4_ = fVar236 * auVar121._28_4_;
          auVar70 = vsubps_avx((undefined1  [16])0x0,auVar172);
          auVar67 = vshufpd_avx(auVar79,auVar79,3);
          auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar81 = vsubps_avx(auVar67,auVar79);
          auVar84 = vsubps_avx(auVar66,(undefined1  [16])0x0);
          auVar222._0_4_ = auVar81._0_4_ + auVar84._0_4_;
          auVar222._4_4_ = auVar81._4_4_ + auVar84._4_4_;
          auVar222._8_4_ = auVar81._8_4_ + auVar84._8_4_;
          auVar222._12_4_ = auVar81._12_4_ + auVar84._12_4_;
          auVar81 = vshufps_avx(auVar79,auVar79,0xb1);
          auVar84 = vshufps_avx(auVar200,auVar200,0xb1);
          auVar85 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar65 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar271._4_4_ = auVar222._0_4_;
          auVar271._0_4_ = auVar222._0_4_;
          auVar271._8_4_ = auVar222._0_4_;
          auVar271._12_4_ = auVar222._0_4_;
          auVar68 = vshufps_avx(auVar222,auVar222,0x55);
          fVar236 = auVar68._0_4_;
          auVar233._0_4_ = auVar81._0_4_ * fVar236;
          fVar245 = auVar68._4_4_;
          auVar233._4_4_ = auVar81._4_4_ * fVar245;
          fVar246 = auVar68._8_4_;
          auVar233._8_4_ = auVar81._8_4_ * fVar246;
          fVar247 = auVar68._12_4_;
          auVar233._12_4_ = auVar81._12_4_ * fVar247;
          auVar238._0_4_ = auVar84._0_4_ * fVar236;
          auVar238._4_4_ = auVar84._4_4_ * fVar245;
          auVar238._8_4_ = auVar84._8_4_ * fVar246;
          auVar238._12_4_ = auVar84._12_4_ * fVar247;
          auVar253._0_4_ = auVar85._0_4_ * fVar236;
          auVar253._4_4_ = auVar85._4_4_ * fVar245;
          auVar253._8_4_ = auVar85._8_4_ * fVar246;
          auVar253._12_4_ = auVar85._12_4_ * fVar247;
          auVar223._0_4_ = auVar65._0_4_ * fVar236;
          auVar223._4_4_ = auVar65._4_4_ * fVar245;
          auVar223._8_4_ = auVar65._8_4_ * fVar246;
          auVar223._12_4_ = auVar65._12_4_ * fVar247;
          auVar81 = vfmadd231ps_fma(auVar233,auVar271,auVar79);
          auVar84 = vfmadd231ps_fma(auVar238,auVar271,auVar200);
          auVar71 = vfmadd231ps_fma(auVar253,auVar271,auVar70);
          auVar72 = vfmadd231ps_fma(auVar223,(undefined1  [16])0x0,auVar271);
          auVar68 = vshufpd_avx(auVar81,auVar81,1);
          auVar69 = vshufpd_avx(auVar84,auVar84,1);
          auVar80 = vshufpd_avx512vl(auVar71,auVar71,1);
          auVar86 = vshufpd_avx512vl(auVar72,auVar72,1);
          auVar85 = vminss_avx(auVar81,auVar84);
          auVar81 = vmaxss_avx(auVar84,auVar81);
          auVar65 = vminss_avx(auVar71,auVar72);
          auVar84 = vmaxss_avx(auVar72,auVar71);
          auVar85 = vminss_avx(auVar85,auVar65);
          auVar81 = vmaxss_avx(auVar84,auVar81);
          auVar65 = vminss_avx(auVar68,auVar69);
          auVar84 = vmaxss_avx(auVar69,auVar68);
          auVar68 = vminss_avx512f(auVar80,auVar86);
          auVar69 = vmaxss_avx512f(auVar86,auVar80);
          auVar84 = vmaxss_avx(auVar69,auVar84);
          auVar65 = vminss_avx512f(auVar65,auVar68);
          vucomiss_avx512f(auVar85);
          fVar245 = auVar84._0_4_;
          fVar236 = auVar81._0_4_;
          if (uVar50 < 5) {
LAB_01b95940:
            auVar68 = vucomiss_avx512f(auVar65);
            bVar61 = fVar245 <= -0.0001;
            bVar59 = -0.0001 < fVar236;
            bVar58 = bVar61;
            if (!bVar61) goto LAB_01b95986;
            uVar26 = vcmpps_avx512vl(auVar85,auVar68,5);
            uVar27 = vcmpps_avx512vl(auVar65,auVar68,5);
            bVar49 = (byte)uVar26 & (byte)uVar27 & 1;
            bVar61 = bVar59 && bVar49 == 0;
            bVar58 = bVar59 && bVar49 == 0;
            if (bVar59 && bVar49 == 0) goto LAB_01b95986;
          }
          else {
            bVar61 = fVar245 == -0.0001;
            bVar58 = NAN(fVar245);
            if (fVar245 <= -0.0001) goto LAB_01b95940;
LAB_01b95986:
            vcmpss_avx512f(auVar85,auVar75,1);
            auVar71 = auVar286._0_16_;
            uVar26 = vcmpss_avx512f(auVar81,auVar75,1);
            bVar59 = (bool)((byte)uVar26 & 1);
            auVar110._0_16_ = auVar71;
            iVar123 = auVar286._0_4_;
            auVar285._4_60_ = auVar110._4_60_;
            auVar285._0_4_ = (float)((uint)bVar59 * -0x40800000 + (uint)!bVar59 * iVar123);
            vucomiss_avx512f(auVar285._0_16_);
            bVar58 = (bool)(!bVar61 | bVar58);
            bVar59 = bVar58 == false;
            auVar112._16_48_ = auVar110._16_48_;
            auVar112._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar111._4_60_ = auVar112._4_60_;
            auVar111._0_4_ = (uint)bVar58 * auVar133._0_4_ + (uint)!bVar58 * 0x7f800000;
            auVar69 = auVar111._0_16_;
            auVar114._16_48_ = auVar110._16_48_;
            auVar114._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar113._4_60_ = auVar114._4_60_;
            auVar113._0_4_ = (uint)bVar58 * auVar133._0_4_ + (uint)!bVar58 * -0x800000;
            auVar68 = auVar113._0_16_;
            uVar26 = vcmpss_avx512f(auVar65,auVar75,1);
            bVar61 = (bool)((byte)uVar26 & 1);
            auVar116._16_48_ = auVar110._16_48_;
            auVar116._0_16_ = auVar71;
            auVar115._4_60_ = auVar116._4_60_;
            auVar115._0_4_ = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * iVar123);
            vucomiss_avx512f(auVar115._0_16_);
            if ((bVar58) || (bVar59)) {
              auVar65 = vucomiss_avx512f(auVar85);
              if ((bVar58) || (bVar59)) {
                auVar72 = vxorps_avx512vl(auVar85,auVar287._0_16_);
                auVar85 = vsubss_avx512f(auVar65,auVar85);
                auVar85 = vdivss_avx512f(auVar72,auVar85);
                auVar65 = vsubss_avx512f(auVar71,auVar85);
                auVar65 = vfmadd213ss_avx512f(auVar65,auVar75,auVar85);
                auVar85 = auVar65;
              }
              else {
                auVar65 = vxorps_avx512vl(auVar65,auVar65);
                vucomiss_avx512f(auVar65);
                if ((bVar58) || (auVar85 = auVar71, bVar59)) {
                  auVar65 = ZEXT416(0x7f800000);
                  auVar85 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar69 = vminss_avx512f(auVar69,auVar65);
              auVar68 = vmaxss_avx(auVar85,auVar68);
            }
            uVar26 = vcmpss_avx512f(auVar84,auVar75,1);
            bVar61 = (bool)((byte)uVar26 & 1);
            fVar246 = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * iVar123);
            if ((auVar285._0_4_ != fVar246) || (NAN(auVar285._0_4_) || NAN(fVar246))) {
              if ((fVar245 != fVar236) || (NAN(fVar245) || NAN(fVar236))) {
                auVar81 = vxorps_avx512vl(auVar81,auVar287._0_16_);
                auVar224._0_4_ = auVar81._0_4_ / (fVar245 - fVar236);
                auVar224._4_12_ = auVar81._4_12_;
                auVar81 = vsubss_avx512f(auVar71,auVar224);
                auVar81 = vfmadd213ss_avx512f(auVar81,auVar75,auVar224);
                auVar84 = auVar81;
              }
              else if ((fVar236 != 0.0) ||
                      (auVar81 = auVar71, auVar84 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar236))) {
                auVar81 = SUB6416(ZEXT464(0xff800000),0);
                auVar84 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar69 = vminss_avx(auVar69,auVar84);
              auVar68 = vmaxss_avx(auVar81,auVar68);
            }
            bVar61 = auVar115._0_4_ != fVar246;
            auVar81 = vminss_avx512f(auVar69,auVar71);
            auVar118._16_48_ = auVar110._16_48_;
            auVar118._0_16_ = auVar69;
            auVar117._4_60_ = auVar118._4_60_;
            auVar117._0_4_ = (uint)bVar61 * auVar81._0_4_ + (uint)!bVar61 * auVar69._0_4_;
            auVar81 = vmaxss_avx512f(auVar71,auVar68);
            auVar120._16_48_ = auVar110._16_48_;
            auVar120._0_16_ = auVar68;
            auVar119._4_60_ = auVar120._4_60_;
            auVar119._0_4_ = (uint)bVar61 * auVar81._0_4_ + (uint)!bVar61 * auVar68._0_4_;
            auVar81 = vmaxss_avx512f(auVar75,auVar117._0_16_);
            auVar84 = vminss_avx512f(auVar119._0_16_,auVar71);
            if (auVar81._0_4_ <= auVar84._0_4_) {
              auVar72 = vmaxss_avx512f(auVar75,ZEXT416((uint)(auVar81._0_4_ + -0.1)));
              auVar86 = vminss_avx512f(ZEXT416((uint)(auVar84._0_4_ + 0.1)),auVar71);
              auVar148._0_8_ = auVar79._0_8_;
              auVar148._8_8_ = auVar148._0_8_;
              auVar239._8_8_ = auVar200._0_8_;
              auVar239._0_8_ = auVar200._0_8_;
              auVar254._8_8_ = auVar70._0_8_;
              auVar254._0_8_ = auVar70._0_8_;
              auVar81 = vshufpd_avx(auVar200,auVar200,3);
              auVar84 = vshufpd_avx(auVar70,auVar70,3);
              auVar85 = vshufps_avx(auVar72,auVar86,0);
              auVar272._8_4_ = 0x3f800000;
              auVar272._0_8_ = 0x3f8000003f800000;
              auVar272._12_4_ = 0x3f800000;
              auVar65 = vsubps_avx(auVar272,auVar85);
              fVar236 = auVar85._0_4_;
              auVar189._0_4_ = fVar236 * auVar67._0_4_;
              fVar245 = auVar85._4_4_;
              auVar189._4_4_ = fVar245 * auVar67._4_4_;
              fVar246 = auVar85._8_4_;
              auVar189._8_4_ = fVar246 * auVar67._8_4_;
              fVar247 = auVar85._12_4_;
              auVar189._12_4_ = fVar247 * auVar67._12_4_;
              auVar201._0_4_ = fVar236 * auVar81._0_4_;
              auVar201._4_4_ = fVar245 * auVar81._4_4_;
              auVar201._8_4_ = fVar246 * auVar81._8_4_;
              auVar201._12_4_ = fVar247 * auVar81._12_4_;
              auVar276._0_4_ = auVar84._0_4_ * fVar236;
              auVar276._4_4_ = auVar84._4_4_ * fVar245;
              auVar276._8_4_ = auVar84._8_4_ * fVar246;
              auVar276._12_4_ = auVar84._12_4_ * fVar247;
              auVar173._0_4_ = fVar236 * auVar66._0_4_;
              auVar173._4_4_ = fVar245 * auVar66._4_4_;
              auVar173._8_4_ = fVar246 * auVar66._8_4_;
              auVar173._12_4_ = fVar247 * auVar66._12_4_;
              auVar67 = vfmadd231ps_fma(auVar189,auVar65,auVar148);
              auVar66 = vfmadd231ps_fma(auVar201,auVar65,auVar239);
              auVar68 = vfmadd231ps_fma(auVar276,auVar65,auVar254);
              auVar69 = vfmadd231ps_fma(auVar173,auVar65,ZEXT816(0));
              auVar84 = vsubss_avx512f(auVar71,auVar72);
              auVar81 = vmovshdup_avx(auVar137);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar72._0_4_)),auVar137,
                                        auVar84);
              auVar84 = vsubss_avx512f(auVar71,auVar86);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar86._0_4_)),auVar137,
                                        auVar84);
              auVar70 = vdivss_avx512f(auVar71,ZEXT416((uint)fVar250));
              auVar81 = vsubps_avx(auVar66,auVar67);
              auVar85 = vmulps_avx512vl(auVar81,auVar76);
              auVar81 = vsubps_avx(auVar68,auVar66);
              auVar65 = vmulps_avx512vl(auVar81,auVar76);
              auVar81 = vsubps_avx(auVar69,auVar68);
              auVar81 = vmulps_avx512vl(auVar81,auVar76);
              auVar84 = vminps_avx(auVar65,auVar81);
              auVar81 = vmaxps_avx(auVar65,auVar81);
              auVar84 = vminps_avx(auVar85,auVar84);
              auVar81 = vmaxps_avx(auVar85,auVar81);
              auVar85 = vshufpd_avx(auVar84,auVar84,3);
              auVar65 = vshufpd_avx(auVar81,auVar81,3);
              auVar84 = vminps_avx(auVar84,auVar85);
              auVar81 = vmaxps_avx(auVar81,auVar65);
              fVar250 = auVar70._0_4_;
              auVar225._0_4_ = auVar84._0_4_ * fVar250;
              auVar225._4_4_ = auVar84._4_4_ * fVar250;
              auVar225._8_4_ = auVar84._8_4_ * fVar250;
              auVar225._12_4_ = auVar84._12_4_ * fVar250;
              auVar212._0_4_ = fVar250 * auVar81._0_4_;
              auVar212._4_4_ = fVar250 * auVar81._4_4_;
              auVar212._8_4_ = fVar250 * auVar81._8_4_;
              auVar212._12_4_ = fVar250 * auVar81._12_4_;
              auVar70 = vdivss_avx512f(auVar71,ZEXT416((uint)(auVar86._0_4_ - auVar80._0_4_)));
              auVar81 = vshufpd_avx(auVar67,auVar67,3);
              auVar84 = vshufpd_avx(auVar66,auVar66,3);
              auVar85 = vshufpd_avx(auVar68,auVar68,3);
              auVar65 = vshufpd_avx(auVar69,auVar69,3);
              auVar81 = vsubps_avx(auVar81,auVar67);
              auVar67 = vsubps_avx(auVar84,auVar66);
              auVar66 = vsubps_avx(auVar85,auVar68);
              auVar65 = vsubps_avx(auVar65,auVar69);
              auVar84 = vminps_avx(auVar81,auVar67);
              auVar81 = vmaxps_avx(auVar81,auVar67);
              auVar85 = vminps_avx(auVar66,auVar65);
              auVar85 = vminps_avx(auVar84,auVar85);
              auVar84 = vmaxps_avx(auVar66,auVar65);
              auVar81 = vmaxps_avx(auVar81,auVar84);
              fVar250 = auVar70._0_4_;
              auVar255._0_4_ = fVar250 * auVar85._0_4_;
              auVar255._4_4_ = fVar250 * auVar85._4_4_;
              auVar255._8_4_ = fVar250 * auVar85._8_4_;
              auVar255._12_4_ = fVar250 * auVar85._12_4_;
              auVar240._0_4_ = fVar250 * auVar81._0_4_;
              auVar240._4_4_ = fVar250 * auVar81._4_4_;
              auVar240._8_4_ = fVar250 * auVar81._8_4_;
              auVar240._12_4_ = fVar250 * auVar81._12_4_;
              auVar65 = vinsertps_avx(auVar63,auVar80,0x10);
              auVar87 = vpermt2ps_avx512vl(auVar63,_DAT_01feecd0,auVar86);
              auVar138._0_4_ = auVar65._0_4_ + auVar87._0_4_;
              auVar138._4_4_ = auVar65._4_4_ + auVar87._4_4_;
              auVar138._8_4_ = auVar65._8_4_ + auVar87._8_4_;
              auVar138._12_4_ = auVar65._12_4_ + auVar87._12_4_;
              auVar32._8_4_ = 0x3f000000;
              auVar32._0_8_ = 0x3f0000003f000000;
              auVar32._12_4_ = 0x3f000000;
              auVar70 = vmulps_avx512vl(auVar138,auVar32);
              auVar84 = vshufps_avx(auVar70,auVar70,0x54);
              uVar125 = auVar70._0_4_;
              auVar142._4_4_ = uVar125;
              auVar142._0_4_ = uVar125;
              auVar142._8_4_ = uVar125;
              auVar142._12_4_ = uVar125;
              auVar67 = vfmadd213ps_avx512vl(local_470,auVar142,auVar74);
              auVar66 = vfmadd213ps_avx512vl(local_480,auVar142,auVar73);
              auVar85 = vfmadd213ps_fma(local_490,auVar142,local_600);
              auVar81 = vsubps_avx(auVar66,auVar67);
              auVar67 = vfmadd213ps_fma(auVar81,auVar142,auVar67);
              auVar81 = vsubps_avx(auVar85,auVar66);
              auVar81 = vfmadd213ps_fma(auVar81,auVar142,auVar66);
              auVar81 = vsubps_avx(auVar81,auVar67);
              auVar85 = vfmadd231ps_fma(auVar67,auVar81,auVar142);
              auVar68 = vmulps_avx512vl(auVar81,auVar76);
              auVar264._8_8_ = auVar85._0_8_;
              auVar264._0_8_ = auVar85._0_8_;
              auVar81 = vshufpd_avx(auVar85,auVar85,3);
              auVar85 = vshufps_avx(auVar70,auVar70,0x55);
              auVar67 = vsubps_avx(auVar81,auVar264);
              auVar66 = vfmadd231ps_fma(auVar264,auVar85,auVar67);
              auVar277._8_8_ = auVar68._0_8_;
              auVar277._0_8_ = auVar68._0_8_;
              auVar81 = vshufpd_avx(auVar68,auVar68,3);
              auVar81 = vsubps_avx512vl(auVar81,auVar277);
              auVar81 = vfmadd213ps_avx512vl(auVar81,auVar85,auVar277);
              auVar143._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar143._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar143._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar85 = vmovshdup_avx512vl(auVar81);
              auVar278._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar278._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar278._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar68 = vmovshdup_avx512vl(auVar67);
              auVar69 = vpermt2ps_avx512vl(auVar278,ZEXT416(5),auVar67);
              auVar85 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar85._0_4_ * auVar67._0_4_)),auVar81,
                                            auVar68);
              auVar67 = vpermt2ps_avx512vl(auVar81,SUB6416(ZEXT464(4),0),auVar143);
              auVar174._0_4_ = auVar85._0_4_;
              auVar174._4_4_ = auVar174._0_4_;
              auVar174._8_4_ = auVar174._0_4_;
              auVar174._12_4_ = auVar174._0_4_;
              auVar81 = vdivps_avx(auVar69,auVar174);
              auVar88 = vdivps_avx512vl(auVar67,auVar174);
              fVar250 = auVar66._0_4_;
              auVar85 = vshufps_avx(auVar66,auVar66,0x55);
              auVar265._0_4_ = fVar250 * auVar81._0_4_ + auVar85._0_4_ * auVar88._0_4_;
              auVar265._4_4_ = fVar250 * auVar81._4_4_ + auVar85._4_4_ * auVar88._4_4_;
              auVar265._8_4_ = fVar250 * auVar81._8_4_ + auVar85._8_4_ * auVar88._8_4_;
              auVar265._12_4_ = fVar250 * auVar81._12_4_ + auVar85._12_4_ * auVar88._12_4_;
              auVar72 = vsubps_avx(auVar84,auVar265);
              auVar85 = vmovshdup_avx(auVar81);
              auVar84 = vinsertps_avx(auVar225,auVar255,0x1c);
              auVar279._0_4_ = auVar85._0_4_ * auVar84._0_4_;
              auVar279._4_4_ = auVar85._4_4_ * auVar84._4_4_;
              auVar279._8_4_ = auVar85._8_4_ * auVar84._8_4_;
              auVar279._12_4_ = auVar85._12_4_ * auVar84._12_4_;
              auVar79 = vinsertps_avx512f(auVar212,auVar240,0x1c);
              auVar85 = vmulps_avx512vl(auVar85,auVar79);
              auVar69 = vminps_avx512vl(auVar279,auVar85);
              auVar66 = vmaxps_avx(auVar85,auVar279);
              auVar68 = vmovshdup_avx(auVar88);
              auVar85 = vinsertps_avx(auVar255,auVar225,0x4c);
              auVar256._0_4_ = auVar68._0_4_ * auVar85._0_4_;
              auVar256._4_4_ = auVar68._4_4_ * auVar85._4_4_;
              auVar256._8_4_ = auVar68._8_4_ * auVar85._8_4_;
              auVar256._12_4_ = auVar68._12_4_ * auVar85._12_4_;
              auVar67 = vinsertps_avx(auVar240,auVar212,0x4c);
              auVar241._0_4_ = auVar68._0_4_ * auVar67._0_4_;
              auVar241._4_4_ = auVar68._4_4_ * auVar67._4_4_;
              auVar241._8_4_ = auVar68._8_4_ * auVar67._8_4_;
              auVar241._12_4_ = auVar68._12_4_ * auVar67._12_4_;
              auVar68 = vminps_avx(auVar256,auVar241);
              auVar69 = vaddps_avx512vl(auVar69,auVar68);
              auVar68 = vmaxps_avx(auVar241,auVar256);
              auVar242._0_4_ = auVar66._0_4_ + auVar68._0_4_;
              auVar242._4_4_ = auVar66._4_4_ + auVar68._4_4_;
              auVar242._8_4_ = auVar66._8_4_ + auVar68._8_4_;
              auVar242._12_4_ = auVar66._12_4_ + auVar68._12_4_;
              auVar257._8_8_ = 0x3f80000000000000;
              auVar257._0_8_ = 0x3f80000000000000;
              auVar66 = vsubps_avx(auVar257,auVar242);
              auVar68 = vsubps_avx(auVar257,auVar69);
              auVar69 = vsubps_avx(auVar65,auVar70);
              auVar70 = vsubps_avx(auVar87,auVar70);
              fVar247 = auVar69._0_4_;
              auVar280._0_4_ = fVar247 * auVar66._0_4_;
              fVar248 = auVar69._4_4_;
              auVar280._4_4_ = fVar248 * auVar66._4_4_;
              fVar249 = auVar69._8_4_;
              auVar280._8_4_ = fVar249 * auVar66._8_4_;
              fVar267 = auVar69._12_4_;
              auVar280._12_4_ = fVar267 * auVar66._12_4_;
              auVar89 = vbroadcastss_avx512vl(auVar81);
              auVar84 = vmulps_avx512vl(auVar89,auVar84);
              auVar79 = vmulps_avx512vl(auVar89,auVar79);
              auVar89 = vminps_avx512vl(auVar84,auVar79);
              auVar79 = vmaxps_avx512vl(auVar79,auVar84);
              auVar84 = vbroadcastss_avx512vl(auVar88);
              auVar85 = vmulps_avx512vl(auVar84,auVar85);
              auVar84 = vmulps_avx512vl(auVar84,auVar67);
              auVar67 = vminps_avx512vl(auVar85,auVar84);
              auVar67 = vaddps_avx512vl(auVar89,auVar67);
              auVar69 = vmulps_avx512vl(auVar69,auVar68);
              fVar250 = auVar70._0_4_;
              auVar243._0_4_ = fVar250 * auVar66._0_4_;
              fVar236 = auVar70._4_4_;
              auVar243._4_4_ = fVar236 * auVar66._4_4_;
              fVar245 = auVar70._8_4_;
              auVar243._8_4_ = fVar245 * auVar66._8_4_;
              fVar246 = auVar70._12_4_;
              auVar243._12_4_ = fVar246 * auVar66._12_4_;
              auVar258._0_4_ = fVar250 * auVar68._0_4_;
              auVar258._4_4_ = fVar236 * auVar68._4_4_;
              auVar258._8_4_ = fVar245 * auVar68._8_4_;
              auVar258._12_4_ = fVar246 * auVar68._12_4_;
              auVar84 = vmaxps_avx(auVar84,auVar85);
              auVar213._0_4_ = auVar79._0_4_ + auVar84._0_4_;
              auVar213._4_4_ = auVar79._4_4_ + auVar84._4_4_;
              auVar213._8_4_ = auVar79._8_4_ + auVar84._8_4_;
              auVar213._12_4_ = auVar79._12_4_ + auVar84._12_4_;
              auVar226._8_8_ = 0x3f800000;
              auVar226._0_8_ = 0x3f800000;
              auVar84 = vsubps_avx(auVar226,auVar213);
              auVar85 = vsubps_avx512vl(auVar226,auVar67);
              auVar273._0_4_ = fVar247 * auVar84._0_4_;
              auVar273._4_4_ = fVar248 * auVar84._4_4_;
              auVar273._8_4_ = fVar249 * auVar84._8_4_;
              auVar273._12_4_ = fVar267 * auVar84._12_4_;
              auVar266._0_4_ = fVar247 * auVar85._0_4_;
              auVar266._4_4_ = fVar248 * auVar85._4_4_;
              auVar266._8_4_ = fVar249 * auVar85._8_4_;
              auVar266._12_4_ = fVar267 * auVar85._12_4_;
              auVar214._0_4_ = fVar250 * auVar84._0_4_;
              auVar214._4_4_ = fVar236 * auVar84._4_4_;
              auVar214._8_4_ = fVar245 * auVar84._8_4_;
              auVar214._12_4_ = fVar246 * auVar84._12_4_;
              auVar227._0_4_ = fVar250 * auVar85._0_4_;
              auVar227._4_4_ = fVar236 * auVar85._4_4_;
              auVar227._8_4_ = fVar245 * auVar85._8_4_;
              auVar227._12_4_ = fVar246 * auVar85._12_4_;
              auVar84 = vminps_avx(auVar273,auVar266);
              auVar85 = vminps_avx512vl(auVar214,auVar227);
              auVar67 = vminps_avx512vl(auVar84,auVar85);
              auVar84 = vmaxps_avx(auVar266,auVar273);
              auVar85 = vmaxps_avx(auVar227,auVar214);
              auVar85 = vmaxps_avx(auVar85,auVar84);
              auVar66 = vminps_avx512vl(auVar280,auVar69);
              auVar84 = vminps_avx(auVar243,auVar258);
              auVar84 = vminps_avx(auVar66,auVar84);
              auVar84 = vhaddps_avx(auVar67,auVar84);
              auVar66 = vmaxps_avx512vl(auVar69,auVar280);
              auVar67 = vmaxps_avx(auVar258,auVar243);
              auVar67 = vmaxps_avx(auVar67,auVar66);
              auVar85 = vhaddps_avx(auVar85,auVar67);
              auVar84 = vshufps_avx(auVar84,auVar84,0xe8);
              auVar85 = vshufps_avx(auVar85,auVar85,0xe8);
              auVar215._0_4_ = auVar84._0_4_ + auVar72._0_4_;
              auVar215._4_4_ = auVar84._4_4_ + auVar72._4_4_;
              auVar215._8_4_ = auVar84._8_4_ + auVar72._8_4_;
              auVar215._12_4_ = auVar84._12_4_ + auVar72._12_4_;
              auVar228._0_4_ = auVar85._0_4_ + auVar72._0_4_;
              auVar228._4_4_ = auVar85._4_4_ + auVar72._4_4_;
              auVar228._8_4_ = auVar85._8_4_ + auVar72._8_4_;
              auVar228._12_4_ = auVar85._12_4_ + auVar72._12_4_;
              auVar84 = vmaxps_avx(auVar65,auVar215);
              auVar85 = vminps_avx(auVar228,auVar87);
              uVar3 = vcmpps_avx512vl(auVar85,auVar84,1);
              if ((uVar3 & 3) == 0) {
                uVar3 = vcmpps_avx512vl(auVar228,auVar87,1);
                uVar26 = vcmpps_avx512vl(auVar63,auVar215,1);
                if (((ushort)uVar26 & (ushort)uVar3 & 1) == 0) {
                  bVar49 = 0;
                }
                else {
                  auVar84 = vmovshdup_avx(auVar215);
                  bVar49 = auVar80._0_4_ < auVar84._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
                }
                if (((3 < uVar50 || uVar8 != 0 && !bVar60) | bVar49) != 1) {
                  auVar137 = vinsertps_avx(auVar80,auVar86,0x10);
                  auVar285 = ZEXT1664(local_610);
                  goto LAB_01b951aa;
                }
                lVar53 = 200;
                do {
                  auVar63 = vsubss_avx512f(auVar71,auVar72);
                  fVar245 = auVar63._0_4_;
                  fVar250 = fVar245 * fVar245 * fVar245;
                  auVar63 = vmulss_avx512f(auVar72,ZEXT416(0x40400000));
                  fVar236 = auVar63._0_4_ * fVar245 * fVar245;
                  fVar246 = auVar72._0_4_;
                  auVar85 = ZEXT416(0x40400000);
                  auVar63 = vmulss_avx512f(ZEXT416((uint)(fVar246 * fVar246)),auVar85);
                  fVar245 = fVar245 * auVar63._0_4_;
                  auVar158._4_4_ = fVar250;
                  auVar158._0_4_ = fVar250;
                  auVar158._8_4_ = fVar250;
                  auVar158._12_4_ = fVar250;
                  auVar149._4_4_ = fVar236;
                  auVar149._0_4_ = fVar236;
                  auVar149._8_4_ = fVar236;
                  auVar149._12_4_ = fVar236;
                  auVar130._4_4_ = fVar245;
                  auVar130._0_4_ = fVar245;
                  auVar130._8_4_ = fVar245;
                  auVar130._12_4_ = fVar245;
                  fVar246 = fVar246 * fVar246 * fVar246;
                  auVar190._0_4_ = (float)local_460._0_4_ * fVar246;
                  auVar190._4_4_ = (float)local_460._4_4_ * fVar246;
                  auVar190._8_4_ = fStack_458 * fVar246;
                  auVar190._12_4_ = fStack_454 * fVar246;
                  auVar63 = vfmadd231ps_fma(auVar190,local_600,auVar130);
                  auVar63 = vfmadd231ps_fma(auVar63,auVar73,auVar149);
                  auVar63 = vfmadd231ps_fma(auVar63,auVar74,auVar158);
                  auVar131._8_8_ = auVar63._0_8_;
                  auVar131._0_8_ = auVar63._0_8_;
                  auVar63 = vshufpd_avx(auVar63,auVar63,3);
                  auVar84 = vshufps_avx(auVar72,auVar72,0x55);
                  auVar63 = vsubps_avx(auVar63,auVar131);
                  auVar84 = vfmadd213ps_fma(auVar63,auVar84,auVar131);
                  fVar250 = auVar84._0_4_;
                  auVar63 = vshufps_avx(auVar84,auVar84,0x55);
                  auVar132._0_4_ = auVar81._0_4_ * fVar250 + auVar88._0_4_ * auVar63._0_4_;
                  auVar132._4_4_ = auVar81._4_4_ * fVar250 + auVar88._4_4_ * auVar63._4_4_;
                  auVar132._8_4_ = auVar81._8_4_ * fVar250 + auVar88._8_4_ * auVar63._8_4_;
                  auVar132._12_4_ = auVar81._12_4_ * fVar250 + auVar88._12_4_ * auVar63._12_4_;
                  auVar72 = vsubps_avx(auVar72,auVar132);
                  auVar63 = vandps_avx512vl(auVar84,auVar284._0_16_);
                  auVar84 = vprolq_avx512vl(auVar63,0x20);
                  auVar63 = vmaxss_avx(auVar84,auVar63);
                  bVar60 = (float)local_450._0_4_ < auVar63._0_4_;
                  if (auVar63._0_4_ < (float)local_450._0_4_) {
                    auVar63 = vucomiss_avx512f(auVar75);
                    if (bVar60) break;
                    auVar81 = vucomiss_avx512f(auVar63);
                    auVar286 = ZEXT1664(auVar81);
                    if (bVar60) break;
                    vmovshdup_avx(auVar63);
                    auVar81 = vucomiss_avx512f(auVar75);
                    if (bVar60) break;
                    auVar84 = vucomiss_avx512f(auVar81);
                    auVar286 = ZEXT1664(auVar84);
                    if (bVar60) break;
                    auVar65 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar72 = vinsertps_avx(auVar65,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar65 = vdpps_avx(auVar72,local_4a0,0x7f);
                    auVar67 = vdpps_avx(auVar72,local_4b0,0x7f);
                    auVar66 = vdpps_avx(auVar72,local_4c0,0x7f);
                    auVar68 = vdpps_avx(auVar72,local_4d0,0x7f);
                    auVar69 = vdpps_avx(auVar72,local_4e0,0x7f);
                    auVar70 = vdpps_avx(auVar72,local_4f0,0x7f);
                    auVar71 = vdpps_avx(auVar72,local_500,0x7f);
                    auVar72 = vdpps_avx(auVar72,local_510,0x7f);
                    auVar79 = vsubss_avx512f(auVar84,auVar81);
                    fVar247 = auVar81._0_4_;
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar69._0_4_)),auVar79,
                                              auVar65);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar247)),auVar79,
                                              auVar67);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar247)),auVar79,
                                              auVar66);
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar72._0_4_)),auVar79,
                                              auVar68);
                    auVar84 = vsubss_avx512f(auVar84,auVar63);
                    auVar202._0_4_ = auVar84._0_4_;
                    fVar236 = auVar202._0_4_ * auVar202._0_4_ * auVar202._0_4_;
                    auVar84 = vmulss_avx512f(auVar63,auVar85);
                    fVar245 = auVar84._0_4_ * auVar202._0_4_ * auVar202._0_4_;
                    fVar250 = auVar63._0_4_;
                    auVar191._0_4_ = fVar250 * fVar250;
                    auVar191._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                    auVar191._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                    auVar191._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                    auVar84 = vmulss_avx512f(auVar191,auVar85);
                    fVar246 = auVar202._0_4_ * auVar84._0_4_;
                    fVar249 = fVar250 * auVar191._0_4_;
                    auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * auVar66._0_4_)),
                                              ZEXT416((uint)fVar246),auVar67);
                    auVar84 = vfmadd231ss_fma(auVar84,ZEXT416((uint)fVar245),auVar65);
                    auVar81 = vfmadd231ss_fma(auVar84,ZEXT416((uint)fVar236),auVar81);
                    fVar248 = auVar81._0_4_;
                    if ((fVar248 < fVar124) ||
                       (fVar267 = *(float *)(ray + k * 4 + 0x200), fVar267 < fVar248)) break;
                    auVar81 = vshufps_avx(auVar63,auVar63,0x55);
                    auVar229._8_4_ = 0x3f800000;
                    auVar229._0_8_ = 0x3f8000003f800000;
                    auVar229._12_4_ = 0x3f800000;
                    auVar84 = vsubps_avx(auVar229,auVar81);
                    fVar204 = auVar81._0_4_;
                    auVar234._0_4_ = fVar204 * (float)local_560._0_4_;
                    fVar219 = auVar81._4_4_;
                    auVar234._4_4_ = fVar219 * (float)local_560._4_4_;
                    fVar220 = auVar81._8_4_;
                    auVar234._8_4_ = fVar220 * fStack_558;
                    fVar221 = auVar81._12_4_;
                    auVar234._12_4_ = fVar221 * fStack_554;
                    auVar244._0_4_ = fVar204 * (float)local_570._0_4_;
                    auVar244._4_4_ = fVar219 * (float)local_570._4_4_;
                    auVar244._8_4_ = fVar220 * fStack_568;
                    auVar244._12_4_ = fVar221 * fStack_564;
                    auVar259._0_4_ = fVar204 * (float)local_580._0_4_;
                    auVar259._4_4_ = fVar219 * (float)local_580._4_4_;
                    auVar259._8_4_ = fVar220 * fStack_578;
                    auVar259._12_4_ = fVar221 * fStack_574;
                    auVar216._0_4_ = fVar204 * (float)local_590._0_4_;
                    auVar216._4_4_ = fVar219 * (float)local_590._4_4_;
                    auVar216._8_4_ = fVar220 * fStack_588;
                    auVar216._12_4_ = fVar221 * fStack_584;
                    auVar81 = vfmadd231ps_fma(auVar234,auVar84,local_520);
                    auVar85 = vfmadd231ps_fma(auVar244,auVar84,local_530);
                    auVar65 = vfmadd231ps_fma(auVar259,auVar84,local_540);
                    auVar67 = vfmadd231ps_fma(auVar216,auVar84,local_550);
                    auVar81 = vsubps_avx(auVar85,auVar81);
                    auVar84 = vsubps_avx(auVar65,auVar85);
                    auVar85 = vsubps_avx(auVar67,auVar65);
                    auVar260._0_4_ = fVar250 * auVar84._0_4_;
                    auVar260._4_4_ = fVar250 * auVar84._4_4_;
                    auVar260._8_4_ = fVar250 * auVar84._8_4_;
                    auVar260._12_4_ = fVar250 * auVar84._12_4_;
                    auVar202._4_4_ = auVar202._0_4_;
                    auVar202._8_4_ = auVar202._0_4_;
                    auVar202._12_4_ = auVar202._0_4_;
                    auVar81 = vfmadd231ps_fma(auVar260,auVar202,auVar81);
                    auVar217._0_4_ = fVar250 * auVar85._0_4_;
                    auVar217._4_4_ = fVar250 * auVar85._4_4_;
                    auVar217._8_4_ = fVar250 * auVar85._8_4_;
                    auVar217._12_4_ = fVar250 * auVar85._12_4_;
                    auVar84 = vfmadd231ps_fma(auVar217,auVar202,auVar84);
                    auVar218._0_4_ = fVar250 * auVar84._0_4_;
                    auVar218._4_4_ = fVar250 * auVar84._4_4_;
                    auVar218._8_4_ = fVar250 * auVar84._8_4_;
                    auVar218._12_4_ = fVar250 * auVar84._12_4_;
                    auVar81 = vfmadd231ps_fma(auVar218,auVar202,auVar81);
                    auVar76 = vmulps_avx512vl(auVar81,auVar76);
                    pGVar9 = (context->scene->geometries).items[uVar57].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar192._0_4_ = fVar249 * (float)local_5d0._0_4_;
                    auVar192._4_4_ = fVar249 * (float)local_5d0._4_4_;
                    auVar192._8_4_ = fVar249 * fStack_5c8;
                    auVar192._12_4_ = fVar249 * fStack_5c4;
                    auVar175._4_4_ = fVar246;
                    auVar175._0_4_ = fVar246;
                    auVar175._8_4_ = fVar246;
                    auVar175._12_4_ = fVar246;
                    auVar81 = vfmadd132ps_fma(auVar175,auVar192,local_5c0);
                    auVar159._4_4_ = fVar245;
                    auVar159._0_4_ = fVar245;
                    auVar159._8_4_ = fVar245;
                    auVar159._12_4_ = fVar245;
                    auVar81 = vfmadd132ps_fma(auVar159,auVar81,local_5b0);
                    auVar150._4_4_ = fVar236;
                    auVar150._0_4_ = fVar236;
                    auVar150._8_4_ = fVar236;
                    auVar150._12_4_ = fVar236;
                    auVar85 = vfmadd132ps_fma(auVar150,auVar81,local_5a0);
                    auVar81 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar84 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar151._0_4_ = auVar85._0_4_ * auVar84._0_4_;
                    auVar151._4_4_ = auVar85._4_4_ * auVar84._4_4_;
                    auVar151._8_4_ = auVar85._8_4_ * auVar84._8_4_;
                    auVar151._12_4_ = auVar85._12_4_ * auVar84._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar151,auVar76,auVar81);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar248;
                      uVar125 = vextractps_avx(auVar76,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar125;
                      uVar125 = vextractps_avx(auVar76,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar125;
                      *(int *)(ray + k * 4 + 0x380) = auVar76._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar250;
                      *(float *)(ray + k * 4 + 0x400) = fVar247;
                      *(uint *)(ray + k * 4 + 0x440) = uVar7;
                      *(uint *)(ray + k * 4 + 0x480) = uVar57;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar63);
                    auVar121 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar121,ZEXT1664(auVar63));
                    auVar121 = vpermps_avx512f(auVar121,ZEXT1664(auVar76));
                    auVar285 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar285,ZEXT1664(auVar76));
                    local_240 = vbroadcastss_avx512f(auVar76);
                    local_2c0[0] = (RTCHitN)auVar121[0];
                    local_2c0[1] = (RTCHitN)auVar121[1];
                    local_2c0[2] = (RTCHitN)auVar121[2];
                    local_2c0[3] = (RTCHitN)auVar121[3];
                    local_2c0[4] = (RTCHitN)auVar121[4];
                    local_2c0[5] = (RTCHitN)auVar121[5];
                    local_2c0[6] = (RTCHitN)auVar121[6];
                    local_2c0[7] = (RTCHitN)auVar121[7];
                    local_2c0[8] = (RTCHitN)auVar121[8];
                    local_2c0[9] = (RTCHitN)auVar121[9];
                    local_2c0[10] = (RTCHitN)auVar121[10];
                    local_2c0[0xb] = (RTCHitN)auVar121[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar121[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar121[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar121[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar121[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar121[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar121[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar121[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar121[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar121[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar121[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar121[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar121[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar121[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar121[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar121[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar121[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar121[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar121[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar121[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar121[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar121[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar121[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar121[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar121[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar121[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar121[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar121[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar121[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar121[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar121[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar121[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar121[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar121[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar121[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar121[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar121[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar121[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar121[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar121[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar121[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar121[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar121[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar121[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar121[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar121[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar121[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar121[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar121[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar121[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar121[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar121[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar121[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar121 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar121);
                    vpcmpeqd_avx2(auVar121._0_32_,auVar121._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar248;
                    auVar121 = vmovdqa64_avx512f(local_380);
                    local_400 = vmovdqa64_avx512f(auVar121);
                    local_640.valid = (int *)local_400;
                    local_640.geometryUserPtr = pGVar9->userPtr;
                    local_640.context = context->user;
                    local_640.hit = local_2c0;
                    local_640.N = 0x10;
                    local_640.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->intersectionFilterN)(&local_640);
                      auVar282 = ZEXT3264(_DAT_01feed20);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar281 = ZEXT1664(auVar63);
                      auVar133._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      in_ZMM19 = ZEXT3264(auVar133._0_32_);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar287 = ZEXT1664(auVar63);
                      auVar286 = ZEXT464(0x3f800000);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar283 = ZEXT1664(auVar63);
                      auVar63 = vxorps_avx512vl(auVar75,auVar75);
                      auVar133 = ZEXT1664(auVar63);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar284 = ZEXT1664(auVar63);
                      auVar121 = vmovdqa64_avx512f(local_400);
                    }
                    auVar110._16_48_ = auVar121._16_48_;
                    auVar63 = auVar133._0_16_;
                    uVar26 = vptestmd_avx512f(auVar121,auVar121);
                    if ((short)uVar26 != 0) {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&local_640);
                        auVar282 = ZEXT3264(_DAT_01feed20);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar281 = ZEXT1664(auVar75);
                        auVar133._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        in_ZMM19 = ZEXT3264(auVar133._0_32_);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar287 = ZEXT1664(auVar75);
                        auVar286 = ZEXT464(0x3f800000);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar283 = ZEXT1664(auVar75);
                        auVar63 = vxorps_avx512vl(auVar63,auVar63);
                        auVar133 = ZEXT1664(auVar63);
                        auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar284 = ZEXT1664(auVar63);
                        auVar121 = vmovdqa64_avx512f(local_400);
                        auVar110._16_48_ = auVar121._16_48_;
                      }
                      uVar3 = vptestmd_avx512f(auVar121,auVar121);
                      if ((short)uVar3 != 0) {
                        iVar123 = *(int *)(local_640.hit + 4);
                        iVar35 = *(int *)(local_640.hit + 8);
                        iVar36 = *(int *)(local_640.hit + 0xc);
                        iVar37 = *(int *)(local_640.hit + 0x10);
                        iVar38 = *(int *)(local_640.hit + 0x14);
                        iVar39 = *(int *)(local_640.hit + 0x18);
                        iVar40 = *(int *)(local_640.hit + 0x1c);
                        iVar41 = *(int *)(local_640.hit + 0x20);
                        iVar42 = *(int *)(local_640.hit + 0x24);
                        iVar43 = *(int *)(local_640.hit + 0x28);
                        iVar44 = *(int *)(local_640.hit + 0x2c);
                        iVar45 = *(int *)(local_640.hit + 0x30);
                        iVar46 = *(int *)(local_640.hit + 0x34);
                        iVar47 = *(int *)(local_640.hit + 0x38);
                        iVar48 = *(int *)(local_640.hit + 0x3c);
                        bVar49 = (byte)uVar3;
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar61 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar59 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                        bVar18 = (byte)(uVar3 >> 8);
                        bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        bVar25 = SUB81(uVar3 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x300) =
                             (uint)(bVar49 & 1) * *(int *)local_640.hit |
                             (uint)!(bool)(bVar49 & 1) * *(int *)(local_640.ray + 0x300);
                        *(uint *)(local_640.ray + 0x304) =
                             (uint)bVar60 * iVar123 |
                             (uint)!bVar60 * *(int *)(local_640.ray + 0x304);
                        *(uint *)(local_640.ray + 0x308) =
                             (uint)bVar61 * iVar35 | (uint)!bVar61 * *(int *)(local_640.ray + 0x308)
                        ;
                        *(uint *)(local_640.ray + 0x30c) =
                             (uint)bVar58 * iVar36 | (uint)!bVar58 * *(int *)(local_640.ray + 0x30c)
                        ;
                        *(uint *)(local_640.ray + 0x310) =
                             (uint)bVar59 * iVar37 | (uint)!bVar59 * *(int *)(local_640.ray + 0x310)
                        ;
                        *(uint *)(local_640.ray + 0x314) =
                             (uint)bVar15 * iVar38 | (uint)!bVar15 * *(int *)(local_640.ray + 0x314)
                        ;
                        *(uint *)(local_640.ray + 0x318) =
                             (uint)bVar16 * iVar39 | (uint)!bVar16 * *(int *)(local_640.ray + 0x318)
                        ;
                        *(uint *)(local_640.ray + 0x31c) =
                             (uint)bVar17 * iVar40 | (uint)!bVar17 * *(int *)(local_640.ray + 0x31c)
                        ;
                        *(uint *)(local_640.ray + 800) =
                             (uint)(bVar18 & 1) * iVar41 |
                             (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 800);
                        *(uint *)(local_640.ray + 0x324) =
                             (uint)bVar19 * iVar42 | (uint)!bVar19 * *(int *)(local_640.ray + 0x324)
                        ;
                        *(uint *)(local_640.ray + 0x328) =
                             (uint)bVar20 * iVar43 | (uint)!bVar20 * *(int *)(local_640.ray + 0x328)
                        ;
                        *(uint *)(local_640.ray + 0x32c) =
                             (uint)bVar21 * iVar44 | (uint)!bVar21 * *(int *)(local_640.ray + 0x32c)
                        ;
                        *(uint *)(local_640.ray + 0x330) =
                             (uint)bVar22 * iVar45 | (uint)!bVar22 * *(int *)(local_640.ray + 0x330)
                        ;
                        *(uint *)(local_640.ray + 0x334) =
                             (uint)bVar23 * iVar46 | (uint)!bVar23 * *(int *)(local_640.ray + 0x334)
                        ;
                        *(uint *)(local_640.ray + 0x338) =
                             (uint)bVar24 * iVar47 | (uint)!bVar24 * *(int *)(local_640.ray + 0x338)
                        ;
                        *(uint *)(local_640.ray + 0x33c) =
                             (uint)bVar25 * iVar48 | (uint)!bVar25 * *(int *)(local_640.ray + 0x33c)
                        ;
                        iVar123 = *(int *)(local_640.hit + 0x44);
                        iVar35 = *(int *)(local_640.hit + 0x48);
                        iVar36 = *(int *)(local_640.hit + 0x4c);
                        iVar37 = *(int *)(local_640.hit + 0x50);
                        iVar38 = *(int *)(local_640.hit + 0x54);
                        iVar39 = *(int *)(local_640.hit + 0x58);
                        iVar40 = *(int *)(local_640.hit + 0x5c);
                        iVar41 = *(int *)(local_640.hit + 0x60);
                        iVar42 = *(int *)(local_640.hit + 100);
                        iVar43 = *(int *)(local_640.hit + 0x68);
                        iVar44 = *(int *)(local_640.hit + 0x6c);
                        iVar45 = *(int *)(local_640.hit + 0x70);
                        iVar46 = *(int *)(local_640.hit + 0x74);
                        iVar47 = *(int *)(local_640.hit + 0x78);
                        iVar48 = *(int *)(local_640.hit + 0x7c);
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar61 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar59 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        bVar25 = SUB81(uVar3 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x340) =
                             (uint)(bVar49 & 1) * *(int *)(local_640.hit + 0x40) |
                             (uint)!(bool)(bVar49 & 1) * *(int *)(local_640.ray + 0x340);
                        *(uint *)(local_640.ray + 0x344) =
                             (uint)bVar60 * iVar123 |
                             (uint)!bVar60 * *(int *)(local_640.ray + 0x344);
                        *(uint *)(local_640.ray + 0x348) =
                             (uint)bVar61 * iVar35 | (uint)!bVar61 * *(int *)(local_640.ray + 0x348)
                        ;
                        *(uint *)(local_640.ray + 0x34c) =
                             (uint)bVar58 * iVar36 | (uint)!bVar58 * *(int *)(local_640.ray + 0x34c)
                        ;
                        *(uint *)(local_640.ray + 0x350) =
                             (uint)bVar59 * iVar37 | (uint)!bVar59 * *(int *)(local_640.ray + 0x350)
                        ;
                        *(uint *)(local_640.ray + 0x354) =
                             (uint)bVar15 * iVar38 | (uint)!bVar15 * *(int *)(local_640.ray + 0x354)
                        ;
                        *(uint *)(local_640.ray + 0x358) =
                             (uint)bVar16 * iVar39 | (uint)!bVar16 * *(int *)(local_640.ray + 0x358)
                        ;
                        *(uint *)(local_640.ray + 0x35c) =
                             (uint)bVar17 * iVar40 | (uint)!bVar17 * *(int *)(local_640.ray + 0x35c)
                        ;
                        *(uint *)(local_640.ray + 0x360) =
                             (uint)(bVar18 & 1) * iVar41 |
                             (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x360);
                        *(uint *)(local_640.ray + 0x364) =
                             (uint)bVar19 * iVar42 | (uint)!bVar19 * *(int *)(local_640.ray + 0x364)
                        ;
                        *(uint *)(local_640.ray + 0x368) =
                             (uint)bVar20 * iVar43 | (uint)!bVar20 * *(int *)(local_640.ray + 0x368)
                        ;
                        *(uint *)(local_640.ray + 0x36c) =
                             (uint)bVar21 * iVar44 | (uint)!bVar21 * *(int *)(local_640.ray + 0x36c)
                        ;
                        *(uint *)(local_640.ray + 0x370) =
                             (uint)bVar22 * iVar45 | (uint)!bVar22 * *(int *)(local_640.ray + 0x370)
                        ;
                        *(uint *)(local_640.ray + 0x374) =
                             (uint)bVar23 * iVar46 | (uint)!bVar23 * *(int *)(local_640.ray + 0x374)
                        ;
                        *(uint *)(local_640.ray + 0x378) =
                             (uint)bVar24 * iVar47 | (uint)!bVar24 * *(int *)(local_640.ray + 0x378)
                        ;
                        *(uint *)(local_640.ray + 0x37c) =
                             (uint)bVar25 * iVar48 | (uint)!bVar25 * *(int *)(local_640.ray + 0x37c)
                        ;
                        iVar123 = *(int *)(local_640.hit + 0x84);
                        iVar35 = *(int *)(local_640.hit + 0x88);
                        iVar36 = *(int *)(local_640.hit + 0x8c);
                        iVar37 = *(int *)(local_640.hit + 0x90);
                        iVar38 = *(int *)(local_640.hit + 0x94);
                        iVar39 = *(int *)(local_640.hit + 0x98);
                        iVar40 = *(int *)(local_640.hit + 0x9c);
                        iVar41 = *(int *)(local_640.hit + 0xa0);
                        iVar42 = *(int *)(local_640.hit + 0xa4);
                        iVar43 = *(int *)(local_640.hit + 0xa8);
                        iVar44 = *(int *)(local_640.hit + 0xac);
                        iVar45 = *(int *)(local_640.hit + 0xb0);
                        iVar46 = *(int *)(local_640.hit + 0xb4);
                        iVar47 = *(int *)(local_640.hit + 0xb8);
                        iVar48 = *(int *)(local_640.hit + 0xbc);
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar61 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar59 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        bVar25 = SUB81(uVar3 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x380) =
                             (uint)(bVar49 & 1) * *(int *)(local_640.hit + 0x80) |
                             (uint)!(bool)(bVar49 & 1) * *(int *)(local_640.ray + 0x380);
                        *(uint *)(local_640.ray + 900) =
                             (uint)bVar60 * iVar123 | (uint)!bVar60 * *(int *)(local_640.ray + 900);
                        *(uint *)(local_640.ray + 0x388) =
                             (uint)bVar61 * iVar35 | (uint)!bVar61 * *(int *)(local_640.ray + 0x388)
                        ;
                        *(uint *)(local_640.ray + 0x38c) =
                             (uint)bVar58 * iVar36 | (uint)!bVar58 * *(int *)(local_640.ray + 0x38c)
                        ;
                        *(uint *)(local_640.ray + 0x390) =
                             (uint)bVar59 * iVar37 | (uint)!bVar59 * *(int *)(local_640.ray + 0x390)
                        ;
                        *(uint *)(local_640.ray + 0x394) =
                             (uint)bVar15 * iVar38 | (uint)!bVar15 * *(int *)(local_640.ray + 0x394)
                        ;
                        *(uint *)(local_640.ray + 0x398) =
                             (uint)bVar16 * iVar39 | (uint)!bVar16 * *(int *)(local_640.ray + 0x398)
                        ;
                        *(uint *)(local_640.ray + 0x39c) =
                             (uint)bVar17 * iVar40 | (uint)!bVar17 * *(int *)(local_640.ray + 0x39c)
                        ;
                        *(uint *)(local_640.ray + 0x3a0) =
                             (uint)(bVar18 & 1) * iVar41 |
                             (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x3a0);
                        *(uint *)(local_640.ray + 0x3a4) =
                             (uint)bVar19 * iVar42 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3a4)
                        ;
                        *(uint *)(local_640.ray + 0x3a8) =
                             (uint)bVar20 * iVar43 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3a8)
                        ;
                        *(uint *)(local_640.ray + 0x3ac) =
                             (uint)bVar21 * iVar44 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3ac)
                        ;
                        *(uint *)(local_640.ray + 0x3b0) =
                             (uint)bVar22 * iVar45 | (uint)!bVar22 * *(int *)(local_640.ray + 0x3b0)
                        ;
                        *(uint *)(local_640.ray + 0x3b4) =
                             (uint)bVar23 * iVar46 | (uint)!bVar23 * *(int *)(local_640.ray + 0x3b4)
                        ;
                        *(uint *)(local_640.ray + 0x3b8) =
                             (uint)bVar24 * iVar47 | (uint)!bVar24 * *(int *)(local_640.ray + 0x3b8)
                        ;
                        *(uint *)(local_640.ray + 0x3bc) =
                             (uint)bVar25 * iVar48 | (uint)!bVar25 * *(int *)(local_640.ray + 0x3bc)
                        ;
                        iVar123 = *(int *)(local_640.hit + 0xc4);
                        iVar35 = *(int *)(local_640.hit + 200);
                        iVar36 = *(int *)(local_640.hit + 0xcc);
                        iVar37 = *(int *)(local_640.hit + 0xd0);
                        iVar38 = *(int *)(local_640.hit + 0xd4);
                        iVar39 = *(int *)(local_640.hit + 0xd8);
                        iVar40 = *(int *)(local_640.hit + 0xdc);
                        iVar41 = *(int *)(local_640.hit + 0xe0);
                        iVar42 = *(int *)(local_640.hit + 0xe4);
                        iVar43 = *(int *)(local_640.hit + 0xe8);
                        iVar44 = *(int *)(local_640.hit + 0xec);
                        iVar45 = *(int *)(local_640.hit + 0xf0);
                        iVar46 = *(int *)(local_640.hit + 0xf4);
                        iVar47 = *(int *)(local_640.hit + 0xf8);
                        iVar48 = *(int *)(local_640.hit + 0xfc);
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar61 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar59 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        bVar25 = SUB81(uVar3 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x3c0) =
                             (uint)(bVar49 & 1) * *(int *)(local_640.hit + 0xc0) |
                             (uint)!(bool)(bVar49 & 1) * *(int *)(local_640.ray + 0x3c0);
                        *(uint *)(local_640.ray + 0x3c4) =
                             (uint)bVar60 * iVar123 |
                             (uint)!bVar60 * *(int *)(local_640.ray + 0x3c4);
                        *(uint *)(local_640.ray + 0x3c8) =
                             (uint)bVar61 * iVar35 | (uint)!bVar61 * *(int *)(local_640.ray + 0x3c8)
                        ;
                        *(uint *)(local_640.ray + 0x3cc) =
                             (uint)bVar58 * iVar36 | (uint)!bVar58 * *(int *)(local_640.ray + 0x3cc)
                        ;
                        *(uint *)(local_640.ray + 0x3d0) =
                             (uint)bVar59 * iVar37 | (uint)!bVar59 * *(int *)(local_640.ray + 0x3d0)
                        ;
                        *(uint *)(local_640.ray + 0x3d4) =
                             (uint)bVar15 * iVar38 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3d4)
                        ;
                        *(uint *)(local_640.ray + 0x3d8) =
                             (uint)bVar16 * iVar39 | (uint)!bVar16 * *(int *)(local_640.ray + 0x3d8)
                        ;
                        *(uint *)(local_640.ray + 0x3dc) =
                             (uint)bVar17 * iVar40 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3dc)
                        ;
                        *(uint *)(local_640.ray + 0x3e0) =
                             (uint)(bVar18 & 1) * iVar41 |
                             (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x3e0);
                        *(uint *)(local_640.ray + 0x3e4) =
                             (uint)bVar19 * iVar42 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3e4)
                        ;
                        *(uint *)(local_640.ray + 1000) =
                             (uint)bVar20 * iVar43 | (uint)!bVar20 * *(int *)(local_640.ray + 1000);
                        *(uint *)(local_640.ray + 0x3ec) =
                             (uint)bVar21 * iVar44 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3ec)
                        ;
                        *(uint *)(local_640.ray + 0x3f0) =
                             (uint)bVar22 * iVar45 | (uint)!bVar22 * *(int *)(local_640.ray + 0x3f0)
                        ;
                        *(uint *)(local_640.ray + 0x3f4) =
                             (uint)bVar23 * iVar46 | (uint)!bVar23 * *(int *)(local_640.ray + 0x3f4)
                        ;
                        *(uint *)(local_640.ray + 0x3f8) =
                             (uint)bVar24 * iVar47 | (uint)!bVar24 * *(int *)(local_640.ray + 0x3f8)
                        ;
                        *(uint *)(local_640.ray + 0x3fc) =
                             (uint)bVar25 * iVar48 | (uint)!bVar25 * *(int *)(local_640.ray + 0x3fc)
                        ;
                        iVar123 = *(int *)(local_640.hit + 0x104);
                        iVar35 = *(int *)(local_640.hit + 0x108);
                        iVar36 = *(int *)(local_640.hit + 0x10c);
                        iVar37 = *(int *)(local_640.hit + 0x110);
                        iVar38 = *(int *)(local_640.hit + 0x114);
                        iVar39 = *(int *)(local_640.hit + 0x118);
                        iVar40 = *(int *)(local_640.hit + 0x11c);
                        iVar41 = *(int *)(local_640.hit + 0x120);
                        iVar42 = *(int *)(local_640.hit + 0x124);
                        iVar43 = *(int *)(local_640.hit + 0x128);
                        iVar44 = *(int *)(local_640.hit + 300);
                        iVar45 = *(int *)(local_640.hit + 0x130);
                        iVar46 = *(int *)(local_640.hit + 0x134);
                        iVar47 = *(int *)(local_640.hit + 0x138);
                        iVar48 = *(int *)(local_640.hit + 0x13c);
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar61 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar59 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        bVar25 = SUB81(uVar3 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x400) =
                             (uint)(bVar49 & 1) * *(int *)(local_640.hit + 0x100) |
                             (uint)!(bool)(bVar49 & 1) * *(int *)(local_640.ray + 0x400);
                        *(uint *)(local_640.ray + 0x404) =
                             (uint)bVar60 * iVar123 |
                             (uint)!bVar60 * *(int *)(local_640.ray + 0x404);
                        *(uint *)(local_640.ray + 0x408) =
                             (uint)bVar61 * iVar35 | (uint)!bVar61 * *(int *)(local_640.ray + 0x408)
                        ;
                        *(uint *)(local_640.ray + 0x40c) =
                             (uint)bVar58 * iVar36 | (uint)!bVar58 * *(int *)(local_640.ray + 0x40c)
                        ;
                        *(uint *)(local_640.ray + 0x410) =
                             (uint)bVar59 * iVar37 | (uint)!bVar59 * *(int *)(local_640.ray + 0x410)
                        ;
                        *(uint *)(local_640.ray + 0x414) =
                             (uint)bVar15 * iVar38 | (uint)!bVar15 * *(int *)(local_640.ray + 0x414)
                        ;
                        *(uint *)(local_640.ray + 0x418) =
                             (uint)bVar16 * iVar39 | (uint)!bVar16 * *(int *)(local_640.ray + 0x418)
                        ;
                        *(uint *)(local_640.ray + 0x41c) =
                             (uint)bVar17 * iVar40 | (uint)!bVar17 * *(int *)(local_640.ray + 0x41c)
                        ;
                        *(uint *)(local_640.ray + 0x420) =
                             (uint)(bVar18 & 1) * iVar41 |
                             (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x420);
                        *(uint *)(local_640.ray + 0x424) =
                             (uint)bVar19 * iVar42 | (uint)!bVar19 * *(int *)(local_640.ray + 0x424)
                        ;
                        *(uint *)(local_640.ray + 0x428) =
                             (uint)bVar20 * iVar43 | (uint)!bVar20 * *(int *)(local_640.ray + 0x428)
                        ;
                        *(uint *)(local_640.ray + 0x42c) =
                             (uint)bVar21 * iVar44 | (uint)!bVar21 * *(int *)(local_640.ray + 0x42c)
                        ;
                        *(uint *)(local_640.ray + 0x430) =
                             (uint)bVar22 * iVar45 | (uint)!bVar22 * *(int *)(local_640.ray + 0x430)
                        ;
                        *(uint *)(local_640.ray + 0x434) =
                             (uint)bVar23 * iVar46 | (uint)!bVar23 * *(int *)(local_640.ray + 0x434)
                        ;
                        *(uint *)(local_640.ray + 0x438) =
                             (uint)bVar24 * iVar47 | (uint)!bVar24 * *(int *)(local_640.ray + 0x438)
                        ;
                        *(uint *)(local_640.ray + 0x43c) =
                             (uint)bVar25 * iVar48 | (uint)!bVar25 * *(int *)(local_640.ray + 0x43c)
                        ;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x140));
                        auVar121 = vmovdqu32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_640.ray + 0x440) = auVar121;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x180));
                        auVar121 = vmovdqu32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_640.ray + 0x480) = auVar121;
                        auVar285 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x1c0));
                        auVar121 = vmovdqa32_avx512f(auVar285);
                        *(undefined1 (*) [64])(local_640.ray + 0x4c0) = auVar121;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x200));
                        bVar60 = (bool)((byte)(uVar3 >> 1) & 1);
                        auVar34._4_56_ = auVar121._8_56_;
                        auVar34._0_4_ =
                             (uint)bVar60 * auVar121._4_4_ | (uint)!bVar60 * auVar285._4_4_;
                        auVar122._0_8_ = auVar34._0_8_ << 0x20;
                        bVar60 = (bool)((byte)(uVar3 >> 2) & 1);
                        auVar122._8_4_ =
                             (uint)bVar60 * auVar121._8_4_ | (uint)!bVar60 * auVar285._8_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 3) & 1);
                        auVar122._12_4_ =
                             (uint)bVar60 * auVar121._12_4_ | (uint)!bVar60 * auVar285._12_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 4) & 1);
                        auVar122._16_4_ =
                             (uint)bVar60 * auVar121._16_4_ | (uint)!bVar60 * auVar285._16_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 5) & 1);
                        auVar122._20_4_ =
                             (uint)bVar60 * auVar121._20_4_ | (uint)!bVar60 * auVar285._20_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 6) & 1);
                        auVar122._24_4_ =
                             (uint)bVar60 * auVar121._24_4_ | (uint)!bVar60 * auVar285._24_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 7) & 1);
                        auVar122._28_4_ =
                             (uint)bVar60 * auVar121._28_4_ | (uint)!bVar60 * auVar285._28_4_;
                        auVar122._32_4_ =
                             (uint)(bVar18 & 1) * auVar121._32_4_ |
                             (uint)!(bool)(bVar18 & 1) * auVar285._32_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 9) & 1);
                        auVar122._36_4_ =
                             (uint)bVar60 * auVar121._36_4_ | (uint)!bVar60 * auVar285._36_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 10) & 1);
                        auVar122._40_4_ =
                             (uint)bVar60 * auVar121._40_4_ | (uint)!bVar60 * auVar285._40_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        auVar122._44_4_ =
                             (uint)bVar60 * auVar121._44_4_ | (uint)!bVar60 * auVar285._44_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        auVar122._48_4_ =
                             (uint)bVar60 * auVar121._48_4_ | (uint)!bVar60 * auVar285._48_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        auVar122._52_4_ =
                             (uint)bVar60 * auVar121._52_4_ | (uint)!bVar60 * auVar285._52_4_;
                        bVar60 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        auVar122._56_4_ =
                             (uint)bVar60 * auVar121._56_4_ | (uint)!bVar60 * auVar285._56_4_;
                        bVar60 = SUB81(uVar3 >> 0xf,0);
                        auVar122._60_4_ =
                             (uint)bVar60 * auVar121._60_4_ | (uint)!bVar60 * auVar285._60_4_;
                        auVar110._16_48_ = auVar122._16_48_;
                        auVar121 = vmovdqa32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_640.ray + 0x500) = auVar121;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar267;
                    break;
                  }
                  lVar53 = lVar53 + -1;
                } while (lVar53 != 0);
              }
            }
          }
          auVar285 = ZEXT1664(local_610);
          if (uVar50 == 0) break;
        } while( true );
      }
      uVar125 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar125;
      auVar33._0_4_ = uVar125;
      auVar33._8_4_ = uVar125;
      auVar33._12_4_ = uVar125;
      uVar26 = vcmpps_avx512vl(local_5e0,auVar33,2);
      uVar57 = (uint)uVar62 & (uint)uVar62 + 0xf & (uint)uVar26;
      uVar62 = (ulong)uVar57;
    } while (uVar57 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }